

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  undefined8 *puVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  pointer pnVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  undefined8 uVar12;
  ulong uVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  Real a;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_63;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nne;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_free;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_free;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<50U,_int,_void> local_688;
  cpp_dec_float<50U,_int,_void> local_648;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_610;
  cpp_dec_float<50U,_int,_void> local_608;
  cpp_dec_float<50U,_int,_void> local_5c8;
  cpp_dec_float<50U,_int,_void> local_588;
  cpp_dec_float<50U,_int,_void> local_548;
  cpp_dec_float<50U,_int,_void> local_508;
  cpp_dec_float<50U,_int,_void> local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  cpp_dec_float<50U,_int,_void> local_448;
  double local_408;
  undefined8 uStack_400;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3f8;
  undefined8 uStack_3f0;
  cpp_dec_float<50U,_int,_void> local_3e8;
  cpp_dec_float<50U,_int,_void> local_3a8;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_330;
  cpp_dec_float<50U,_int,_void> local_2f8;
  cpp_dec_float<50U,_int,_void> local_2b8;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1c0;
  double local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined5 uStack_160;
  undefined3 uStack_15b;
  undefined5 local_158;
  undefined3 uStack_153;
  int local_150;
  byte local_14c;
  undefined8 local_148;
  undefined8 local_138;
  uint auStack_130 [4];
  undefined5 uStack_120;
  undefined3 uStack_11b;
  undefined5 local_118;
  undefined3 uStack_113;
  int local_110;
  byte local_10c;
  undefined8 local_108;
  cpp_dec_float<50U,_int,_void> local_f8;
  cpp_dec_float<50U,_int,_void> local_b8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_80;
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [29];
  undefined3 uStack_4b;
  undefined1 auStack_48 [13];
  undefined8 local_38;
  
  local_610 = this;
  a = Tolerances::epsilon((base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_38._0_4_ = cpp_dec_float_finite;
  local_38._4_4_ = 10;
  local_68._0_16_ = (undefined1  [16])0x0;
  local_68._16_13_ = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  auStack_48 = SUB1613((undefined1  [16])0x0,3);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_68,a);
  local_3a8.fpclass = cpp_dec_float_finite;
  local_3a8.prec_elem = 10;
  local_3a8.data._M_elems[0] = 0;
  local_3a8.data._M_elems[1] = 0;
  local_3a8.data._M_elems[2] = 0;
  local_3a8.data._M_elems[3] = 0;
  local_3a8.data._M_elems[4] = 0;
  local_3a8.data._M_elems[5] = 0;
  local_3a8.data._M_elems[6] = 0;
  local_3a8.data._M_elems[7] = 0;
  local_3a8.data._M_elems[8] = 0;
  local_3a8.data._M_elems[9] = 0;
  local_3a8.exp = 0;
  local_3a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_3a8,1.0);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_3f8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_3f0 = 0;
    local_408 = -(double)local_3f8;
    uStack_400 = 0x8000000000000000;
    lVar16 = 0;
    lVar17 = 0;
    do {
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_688.fpclass = cpp_dec_float_finite;
      local_688.prec_elem = 10;
      local_688.data._M_elems[0] = 0;
      local_688.data._M_elems[1] = 0;
      local_688.data._M_elems[2] = 0;
      local_688.data._M_elems[3] = 0;
      local_688.data._M_elems[4] = 0;
      local_688.data._M_elems[5] = 0;
      local_688.data._M_elems._24_5_ = 0;
      local_688.data._M_elems[7]._1_3_ = 0;
      local_688.data._M_elems[8] = 0;
      local_688.data._M_elems[9] = 0;
      local_688.exp = 0;
      local_688.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_3f8);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30) != 2) &&
          (local_688.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar16),&local_688), iVar9 < 0)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_588.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
        local_588.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
        local_588._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x10);
        local_588.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        local_588.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x20);
        local_588.data._M_elems._24_5_ = SUB85(uVar12,0);
        local_588.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
        if ((local_588.neg == true) &&
           (local_588.data._M_elems[0] = (uint)*(undefined8 *)*pauVar1,
           local_588.data._M_elems[0] != 0 || local_588.fpclass != cpp_dec_float_finite)) {
          local_588.neg = false;
        }
        local_588.data._M_elems._0_16_ = auVar6;
        if (((local_588.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_588,&local_3a8), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3a8.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16);
          local_688.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x14);
          local_688.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_688.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16 + 4);
          local_688.data._M_elems._0_16_ = *pauVar1;
          local_3a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
          local_3a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
          if (local_3a8.neg == true) {
            local_3a8.neg =
                 local_3a8.fpclass == cpp_dec_float_finite && local_3a8.data._M_elems[0] == 0;
          }
          local_3a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
          local_3a8.data._M_elems[5] = local_688.data._M_elems[4];
          local_3a8.data._M_elems[6] = local_688.data._M_elems[5];
          local_3a8.data._M_elems[7] = (uint)uVar12;
          local_3a8.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_3a8.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_3a8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_3a8.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_3a8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_3a8.data._M_elems[9] = local_688.data._M_elems[8];
        }
      }
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_688.fpclass = cpp_dec_float_finite;
      local_688.prec_elem = 10;
      local_688.data._M_elems[0] = 0;
      local_688.data._M_elems[1] = 0;
      local_688.data._M_elems[2] = 0;
      local_688.data._M_elems[3] = 0;
      local_688.data._M_elems[4] = 0;
      local_688.data._M_elems[5] = 0;
      local_688.data._M_elems._24_5_ = 0;
      local_688.data._M_elems[7]._1_3_ = 0;
      local_688.data._M_elems[8] = 0;
      local_688.data._M_elems[9] = 0;
      local_688.exp = 0;
      local_688.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_688,local_408);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30) != 2) &&
          (local_688.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar16),&local_688), 0 < iVar9)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_588.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
        local_588.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
        local_588._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x10);
        local_588.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        local_588.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x20);
        local_588.data._M_elems._24_5_ = SUB85(uVar12,0);
        local_588.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
        if ((local_588.neg == true) &&
           (local_588.data._M_elems[0] = (uint)*(undefined8 *)*pauVar1,
           local_588.data._M_elems[0] != 0 || local_588.fpclass != cpp_dec_float_finite)) {
          local_588.neg = false;
        }
        local_588.data._M_elems._0_16_ = auVar6;
        if (((local_588.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_588,&local_3a8), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3a8.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16);
          local_688.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x14);
          local_688.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_688.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16 + 4);
          local_688.data._M_elems._0_16_ = *pauVar1;
          local_3a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
          local_3a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
          if (local_3a8.neg == true) {
            local_3a8.neg =
                 local_3a8.fpclass == cpp_dec_float_finite && local_3a8.data._M_elems[0] == 0;
          }
          local_3a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
          local_3a8.data._M_elems[5] = local_688.data._M_elems[4];
          local_3a8.data._M_elems[6] = local_688.data._M_elems[5];
          local_3a8.data._M_elems[7] = (uint)uVar12;
          local_3a8.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_3a8.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_3a8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_3a8.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_3a8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_3a8.data._M_elems[9] = local_688.data._M_elems[8];
        }
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0x38;
    } while (lVar17 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_3f8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    uStack_3f0 = 0;
    local_408 = -(double)local_3f8;
    uStack_400 = 0x8000000000000000;
    lVar16 = 0;
    lVar17 = 0;
    do {
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_688.fpclass = cpp_dec_float_finite;
      local_688.prec_elem = 10;
      local_688.data._M_elems[0] = 0;
      local_688.data._M_elems[1] = 0;
      local_688.data._M_elems[2] = 0;
      local_688.data._M_elems[3] = 0;
      local_688.data._M_elems[4] = 0;
      local_688.data._M_elems[5] = 0;
      local_688.data._M_elems._24_5_ = 0;
      local_688.data._M_elems[7]._1_3_ = 0;
      local_688.data._M_elems[8] = 0;
      local_688.data._M_elems[9] = 0;
      local_688.exp = 0;
      local_688.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_3f8);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30) != 2) &&
          (local_688.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar16),&local_688), iVar9 < 0)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_588.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
        local_588.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
        local_588._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x10);
        local_588.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        local_588.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x20);
        local_588.data._M_elems._24_5_ = SUB85(uVar12,0);
        local_588.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
        if ((local_588.neg == true) &&
           (local_588.data._M_elems[0] = (uint)*(undefined8 *)*pauVar1,
           local_588.data._M_elems[0] != 0 || local_588.fpclass != cpp_dec_float_finite)) {
          local_588.neg = false;
        }
        local_588.data._M_elems._0_16_ = auVar6;
        if (((local_588.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_588,&local_3a8), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3a8.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16);
          local_688.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x14);
          local_688.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_688.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16 + 4);
          local_688.data._M_elems._0_16_ = *pauVar1;
          local_3a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
          local_3a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
          if (local_3a8.neg == true) {
            local_3a8.neg =
                 local_3a8.fpclass == cpp_dec_float_finite && local_3a8.data._M_elems[0] == 0;
          }
          local_3a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
          local_3a8.data._M_elems[5] = local_688.data._M_elems[4];
          local_3a8.data._M_elems[6] = local_688.data._M_elems[5];
          local_3a8.data._M_elems[7] = (uint)uVar12;
          local_3a8.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_3a8.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_3a8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_3a8.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_3a8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_3a8.data._M_elems[9] = local_688.data._M_elems[8];
        }
      }
      pnVar10 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_688.fpclass = cpp_dec_float_finite;
      local_688.prec_elem = 10;
      local_688.data._M_elems[0] = 0;
      local_688.data._M_elems[1] = 0;
      local_688.data._M_elems[2] = 0;
      local_688.data._M_elems[3] = 0;
      local_688.data._M_elems[4] = 0;
      local_688.data._M_elems[5] = 0;
      local_688.data._M_elems._24_5_ = 0;
      local_688.data._M_elems[7]._1_3_ = 0;
      local_688.data._M_elems[8] = 0;
      local_688.data._M_elems[9] = 0;
      local_688.exp = 0;
      local_688.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_688,local_408);
      if (((*(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30) != 2) &&
          (local_688.fpclass != cpp_dec_float_NaN)) &&
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar10->m_backend).data + lVar16),&local_688), 0 < iVar9)) {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_588.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
        local_588.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
        local_588._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
        pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16);
        auVar6 = *pauVar1;
        puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x10);
        local_588.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        local_588.data._M_elems._32_8_ =
             *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x20);
        local_588.data._M_elems._24_5_ = SUB85(uVar12,0);
        local_588.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
        if ((local_588.neg == true) &&
           (local_588.data._M_elems[0] = (uint)*(undefined8 *)*pauVar1,
           local_588.data._M_elems[0] != 0 || local_588.fpclass != cpp_dec_float_finite)) {
          local_588.neg = false;
        }
        local_588.data._M_elems._0_16_ = auVar6;
        if (((local_588.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_588,&local_3a8), 0 < iVar9)) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3a8.data._M_elems[0] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16);
          local_688.data._M_elems[8] = *(uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x24);
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar16 + 0x14);
          local_688.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar12 = *(undefined8 *)(puVar2 + 2);
          local_688.data._M_elems._24_5_ = SUB85(uVar12,0);
          local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
          pauVar1 = (undefined1 (*) [16])((long)&(pnVar10->m_backend).data + lVar16 + 4);
          local_688.data._M_elems._0_16_ = *pauVar1;
          local_3a8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar16 + 0x2c);
          local_3a8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar16 + 0x30);
          if (local_3a8.neg == true) {
            local_3a8.neg =
                 local_3a8.fpclass == cpp_dec_float_finite && local_3a8.data._M_elems[0] == 0;
          }
          local_3a8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar16 + 0x28);
          local_3a8.data._M_elems[5] = local_688.data._M_elems[4];
          local_3a8.data._M_elems[6] = local_688.data._M_elems[5];
          local_3a8.data._M_elems[7] = (uint)uVar12;
          local_3a8.data._M_elems[8] = (uint)((ulong)uVar12 >> 0x20);
          local_3a8.data._M_elems[1] = (uint)*(undefined8 *)*pauVar1;
          local_3a8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
          local_3a8.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar1 + 8);
          local_3a8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
          local_3a8.data._M_elems[9] = local_688.data._M_elems[8];
        }
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0x38;
    } while (lVar17 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  this_00 = &(base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object;
  if (base->theType * base->theRep < 1) {
    local_3f8 = this_00;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_588,this_00);
    local_448.fpclass = cpp_dec_float_finite;
    local_448.prec_elem = 10;
    local_448.data._M_elems[0] = 0;
    local_448.data._M_elems[1] = 0;
    local_448.data._M_elems[2] = 0;
    local_448.data._M_elems[3] = 0;
    local_448.data._M_elems[4] = 0;
    local_448.data._M_elems[5] = 0;
    local_448.data._M_elems._24_5_ = 0;
    local_448.data._M_elems[7]._1_3_ = 0;
    local_448.data._M_elems._32_5_ = 0;
    local_448.data._M_elems[9]._1_3_ = 0;
    local_448.exp = 0;
    local_448.neg = false;
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems[0] = 0;
    local_688.data._M_elems[1] = 0;
    local_688.data._M_elems[2] = 0;
    local_688.data._M_elems[3] = 0;
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems[8] = 0;
    local_688.data._M_elems[9] = 0;
    local_688.exp = 0;
    local_688.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_688,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_448,&local_688,&local_588);
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems._0_16_ = ZEXT816(0);
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems[8] = 0;
    local_688.data._M_elems[9] = 0;
    local_688.exp = 0;
    local_688.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_688,0.01);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_3e8,&local_688,&local_3a8);
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems[0] = 0;
    local_688.data._M_elems[1] = 0;
    local_688.data._M_elems[2] = 0;
    local_688.data._M_elems[3] = 0;
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems[8] = 0;
    local_688.data._M_elems[9] = 0;
    local_688.exp = 0;
    local_688.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_688,0.0001);
    local_b8.data._M_elems[0] = local_3e8.data._M_elems[0];
    local_b8.data._M_elems[1] = local_3e8.data._M_elems[1];
    local_b8.data._M_elems[2] = local_3e8.data._M_elems[2];
    local_b8.data._M_elems[3] = local_3e8.data._M_elems[3];
    local_b8.data._M_elems[4] = local_3e8.data._M_elems[4];
    local_b8.data._M_elems[5] = local_3e8.data._M_elems[5];
    local_b8.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
    local_b8.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
    local_b8.data._M_elems._32_5_ = local_3e8.data._M_elems._32_5_;
    local_b8.data._M_elems[9]._1_3_ = local_3e8.data._M_elems[9]._1_3_;
    local_b8.exp = local_3e8.exp;
    local_b8.neg = local_3e8.neg;
    local_b8.fpclass = local_3e8.fpclass;
    local_b8.prec_elem = local_3e8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_b8,&local_688)
    ;
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_f8,100000.0);
    local_108._0_4_ = cpp_dec_float_finite;
    local_108._4_4_ = 10;
    local_138._0_4_ = 0;
    local_138._4_4_ = 0;
    auStack_130[0] = 0;
    auStack_130[1] = 0;
    auStack_130[2] = 0;
    auStack_130[3] = 0;
    uStack_120 = 0;
    uStack_11b = 0;
    local_118 = 0;
    uStack_113 = 0;
    local_110 = 0;
    local_10c = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_138,10000.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1c0,1,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_368,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_330,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1f8,0,(type *)0x0);
    local_148._0_4_ = cpp_dec_float_finite;
    local_148._4_4_ = 10;
    local_178._0_4_ = 0;
    local_178._4_4_ = 0;
    uStack_170._0_4_ = 0;
    uStack_170._4_4_ = 0;
    local_168._0_4_ = 0;
    local_168._4_4_ = 0;
    uStack_160 = 0;
    uStack_15b = 0;
    local_158 = 0;
    uStack_153 = 0;
    local_150 = 0;
    local_14c = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_178,-10000.0);
    local_4c8.fpclass = cpp_dec_float_finite;
    local_4c8.prec_elem = 10;
    local_4c8.data._M_elems._0_16_ = ZEXT816(0);
    local_4c8.data._M_elems[4] = 0;
    local_4c8.data._M_elems[5] = 0;
    local_4c8.data._M_elems._24_5_ = 0;
    local_4c8.data._M_elems[7]._1_3_ = 0;
    local_4c8.data._M_elems._32_5_ = 0;
    local_4c8.data._M_elems[9]._1_3_ = 0;
    local_4c8.exp = 0;
    local_4c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_4c8,-100000.0);
    lVar16 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar16) {
      local_408 = *(double *)(in_FS_OFFSET + -8);
      uStack_400 = 0;
      local_188 = -local_408;
      uStack_180 = 0x8000000000000000;
      lVar17 = lVar16 * 0x38;
      uVar13 = lVar16 + 1;
      do {
        local_588.fpclass = cpp_dec_float_finite;
        local_588.prec_elem = 10;
        local_588.data._M_elems[0] = 0;
        local_588.data._M_elems[1] = 0;
        local_588.data._M_elems[2] = 0;
        local_588.data._M_elems[3] = 0;
        local_588.data._M_elems[4] = 0;
        local_588.data._M_elems[5] = 0;
        local_588.data._M_elems._24_5_ = 0;
        local_588.data._M_elems[7]._1_3_ = 0;
        local_588.data._M_elems[8] = 0;
        local_588.data._M_elems[9] = 0;
        local_588.exp = 0;
        local_588.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_688,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[uVar13 - 2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        local_588.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
        local_588.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
        local_588.data._M_elems[4] = local_b8.data._M_elems[4];
        local_588.data._M_elems[5] = local_b8.data._M_elems[5];
        local_588.data._M_elems._24_5_ = local_b8.data._M_elems._24_5_;
        local_588.data._M_elems[7]._1_3_ = local_b8.data._M_elems[7]._1_3_;
        local_588.data._M_elems[2] = local_b8.data._M_elems[2];
        local_588.data._M_elems[3] = local_b8.data._M_elems[3];
        local_588.data._M_elems[0] = local_b8.data._M_elems[0];
        local_588.data._M_elems[1] = local_b8.data._M_elems[1];
        local_588.exp = local_b8.exp;
        local_588.neg = local_b8.neg;
        local_588.fpclass = local_b8.fpclass;
        local_588.prec_elem = local_b8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_588,&local_688);
        auVar6 = (undefined1  [16])local_448.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_508.fpclass = cpp_dec_float_finite;
        local_508.prec_elem = 10;
        local_508.data._M_elems[0] = 0;
        local_508.data._M_elems[1] = 0;
        local_508.data._M_elems[2] = 0;
        local_508.data._M_elems[3] = 0;
        local_508.data._M_elems[4] = 0;
        local_508.data._M_elems[5] = 0;
        local_508.data._M_elems._24_5_ = 0;
        local_508.data._M_elems[7]._1_3_ = 0;
        local_508.data._M_elems._32_5_ = 0;
        local_508.data._M_elems[9]._1_3_ = 0;
        local_508.exp = 0;
        local_508.neg = false;
        pcVar15 = &local_448;
        if (pcVar11 != &local_508) {
          local_508.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
          local_508.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
          local_508.data._M_elems[4] = local_448.data._M_elems[4];
          local_508.data._M_elems[5] = local_448.data._M_elems[5];
          local_508.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
          local_508.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
          local_508.data._M_elems[0] = local_448.data._M_elems[0];
          local_508.data._M_elems[1] = local_448.data._M_elems[1];
          local_508.data._M_elems[2] = local_448.data._M_elems[2];
          local_508.data._M_elems[3] = local_448.data._M_elems[3];
          local_508.exp = local_448.exp;
          local_508.neg = local_448.neg;
          local_508.fpclass = local_448.fpclass;
          local_508.prec_elem = local_448.prec_elem;
          pcVar15 = pcVar11;
        }
        local_448.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_508,pcVar15);
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_488.fpclass = cpp_dec_float_finite;
        local_488.prec_elem = 10;
        local_488.data._M_elems[0] = 0;
        local_488.data._M_elems[1] = 0;
        local_488.data._M_elems[2] = 0;
        local_488.data._M_elems[3] = 0;
        local_488.data._M_elems[4] = 0;
        local_488.data._M_elems[5] = 0;
        local_488.data._M_elems._24_5_ = 0;
        local_488.data._M_elems[7]._1_3_ = 0;
        local_488.data._M_elems._32_5_ = 0;
        local_488.data._M_elems[9]._1_3_ = 0;
        local_488.exp = 0;
        local_488.neg = false;
        pcVar15 = &local_3e8;
        if (pcVar11 != &local_488) {
          local_488.data._M_elems._32_5_ = local_3e8.data._M_elems._32_5_;
          local_488.data._M_elems[9]._1_3_ = local_3e8.data._M_elems[9]._1_3_;
          local_488.data._M_elems[4] = local_3e8.data._M_elems[4];
          local_488.data._M_elems[5] = local_3e8.data._M_elems[5];
          local_488.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
          local_488.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
          local_488.data._M_elems[0] = local_3e8.data._M_elems[0];
          local_488.data._M_elems[1] = local_3e8.data._M_elems[1];
          local_488.data._M_elems[2] = local_3e8.data._M_elems[2];
          local_488.data._M_elems[3] = local_3e8.data._M_elems[3];
          local_488.exp = local_3e8.exp;
          local_488.neg = local_3e8.neg;
          local_488.fpclass = local_3e8.fpclass;
          local_488.prec_elem = local_3e8.prec_elem;
          pcVar15 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_488,pcVar15);
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_5c8.fpclass = cpp_dec_float_finite;
        local_5c8.prec_elem = 10;
        local_5c8.data._M_elems._0_16_ = ZEXT816(0);
        local_5c8.data._M_elems[4] = 0;
        local_5c8.data._M_elems[5] = 0;
        local_5c8.data._M_elems._24_5_ = 0;
        local_5c8.data._M_elems[7]._1_3_ = 0;
        local_5c8.data._M_elems._32_5_ = 0;
        local_5c8.data._M_elems[9]._1_3_ = 0;
        local_5c8.exp = 0;
        local_5c8.neg = false;
        pcVar15 = &local_3e8;
        if (pcVar11 != &local_5c8) {
          local_5c8.data._M_elems._32_5_ = local_3e8.data._M_elems._32_5_;
          local_5c8.data._M_elems[9]._1_3_ = local_3e8.data._M_elems[9]._1_3_;
          local_5c8.data._M_elems[4] = local_3e8.data._M_elems[4];
          local_5c8.data._M_elems[5] = local_3e8.data._M_elems[5];
          local_5c8.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
          local_5c8.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
          local_5c8.data._M_elems[2] = local_3e8.data._M_elems[2];
          local_5c8.data._M_elems[3] = local_3e8.data._M_elems[3];
          local_5c8.data._M_elems[0] = local_3e8.data._M_elems[0];
          local_5c8.data._M_elems[1] = local_3e8.data._M_elems[1];
          local_5c8.exp = local_3e8.exp;
          local_5c8.neg = local_3e8.neg;
          local_5c8.fpclass = local_3e8.fpclass;
          local_5c8.prec_elem = local_3e8.prec_elem;
          pcVar15 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_5c8,pcVar15);
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems._0_16_ = ZEXT816(0);
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems[8] = 0;
        local_688.data._M_elems[9] = 0;
        local_688.exp = 0;
        local_688.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_688,local_408);
        if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
            (local_688.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&pnVar10[-1].m_backend.data + lVar17),&local_688), -1 < iVar9)
           ) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_688.fpclass = cpp_dec_float_finite;
          local_688.prec_elem = 10;
          local_688.data._M_elems._0_16_ = ZEXT816(0);
          local_688.data._M_elems[4] = 0;
          local_688.data._M_elems[5] = 0;
          local_688.data._M_elems._24_5_ = 0;
          local_688.data._M_elems[7]._1_3_ = 0;
          local_688.data._M_elems[8] = 0;
          local_688.data._M_elems[9] = 0;
          local_688.exp = 0;
          local_688.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_688,local_188);
          if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
              (local_688.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar10[-1].m_backend.data + lVar17),&local_688), iVar9 < 1
             )) {
            local_608.data._M_elems._32_5_ = local_158;
            local_608.data._M_elems[9]._1_3_ = uStack_153;
            local_608.data._M_elems[4] = (uint)local_168;
            local_608.data._M_elems[5] = local_168._4_4_;
            local_608.data._M_elems._24_5_ = uStack_160;
            local_608.data._M_elems[7]._1_3_ = uStack_15b;
            local_608.data._M_elems[0] = (uint)local_178;
            local_608.data._M_elems[1] = local_178._4_4_;
            local_608.data._M_elems[2] = (uint)uStack_170;
            local_608.data._M_elems[3] = uStack_170._4_4_;
            local_608.exp = local_150;
            local_608.neg = (bool)local_14c;
            local_608.fpclass = (fpclass_type)local_148;
            local_608.prec_elem = local_148._4_4_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_608,&local_588);
            local_648.data._M_elems[9]._1_3_ = local_508.data._M_elems[9]._1_3_;
            local_648.data._M_elems._32_5_ = local_508.data._M_elems._32_5_;
            local_648.data._M_elems[7]._1_3_ = local_508.data._M_elems[7]._1_3_;
            local_648.data._M_elems._24_5_ = local_508.data._M_elems._24_5_;
            local_648.data._M_elems[4] = local_508.data._M_elems[4];
            local_648.data._M_elems[5] = local_508.data._M_elems[5];
            local_648.data._M_elems[0] = local_508.data._M_elems[0];
            local_648.data._M_elems[1] = local_508.data._M_elems[1];
            uVar12 = local_648.data._M_elems._0_8_;
            local_648.data._M_elems[2] = local_508.data._M_elems[2];
            local_648.data._M_elems[3] = local_508.data._M_elems[3];
            local_648.exp = local_508.exp;
            local_648.neg = local_508.neg;
            local_648.fpclass = local_508.fpclass;
            local_648.prec_elem = local_508.prec_elem;
            if ((local_508.neg == true) &&
               (local_648.data._M_elems[0] = local_508.data._M_elems[0],
               local_508.fpclass != cpp_dec_float_finite || local_648.data._M_elems[0] != 0)) {
              local_648.neg = false;
            }
            local_688.data._M_elems[8] = local_608.data._M_elems[8];
            local_688.data._M_elems[9] =
                 (uint)(CONCAT35(local_608.data._M_elems[9]._1_3_,local_608.data._M_elems._32_5_) >>
                       0x20);
            local_688.data._M_elems[4] = local_608.data._M_elems[4];
            local_688.data._M_elems[5] = local_608.data._M_elems[5];
            local_688.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
            local_688.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
            local_688.data._M_elems[0] = local_608.data._M_elems[0];
            local_688.data._M_elems[1] = local_608.data._M_elems[1];
            local_688.data._M_elems[2] = local_608.data._M_elems[2];
            local_688.data._M_elems[3] = local_608.data._M_elems[3];
            local_688.exp = local_608.exp;
            local_688.neg = local_608.neg;
            local_688.fpclass = local_608.fpclass;
            local_688.prec_elem = local_608.prec_elem;
            local_648.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_688,&local_648);
            goto LAB_0034092f;
          }
          local_648.data._M_elems[8] = local_330.data._M_elems[8];
          local_648.data._M_elems[9] = local_330.data._M_elems[9];
          local_648.data._M_elems[4] = local_330.data._M_elems[4];
          local_648.data._M_elems[5] = local_330.data._M_elems[5];
          local_648.data._M_elems[6] = local_330.data._M_elems[6];
          local_648.data._M_elems[7] = local_330.data._M_elems[7];
          local_648.data._M_elems[0] = local_330.data._M_elems[0];
          local_648.data._M_elems[1] = local_330.data._M_elems[1];
          local_648.data._M_elems[2] = local_330.data._M_elems[2];
          local_648.data._M_elems[3] = local_330.data._M_elems[3];
          local_648.exp = local_330.exp;
          local_648.neg = local_330.neg;
          local_648._48_8_ = local_330._48_8_;
LAB_003406e3:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_648,&local_508);
          local_608.data._M_elems[0] = local_648.data._M_elems[0];
          local_608.data._M_elems[1] = local_648.data._M_elems[1];
          local_608.data._M_elems[2] = local_648.data._M_elems[2];
          local_608.data._M_elems[3] = local_648.data._M_elems[3];
          local_608.data._M_elems[4] = local_648.data._M_elems[4];
          local_608.data._M_elems[5] = local_648.data._M_elems[5];
          local_608.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
          local_608.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
          local_608.data._M_elems._32_5_ = local_648.data._M_elems._32_5_;
          local_608.data._M_elems[9]._1_3_ = local_648.data._M_elems[9]._1_3_;
          local_608.exp = local_648.exp;
          local_608.neg = local_648.neg;
          local_608.fpclass = local_648.fpclass;
          local_608.prec_elem = local_648.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_608,&local_5c8);
          local_688.data._M_elems[0] = local_608.data._M_elems[0];
          local_688.data._M_elems[1] = local_608.data._M_elems[1];
          local_688.data._M_elems[2] = local_608.data._M_elems[2];
          local_688.data._M_elems[3] = local_608.data._M_elems[3];
          local_688.data._M_elems[4] = local_608.data._M_elems[4];
          local_688.data._M_elems[5] = local_608.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
          local_688.data._M_elems[8] = local_608.data._M_elems[8];
          local_688.data._M_elems[9] =
               (uint)(CONCAT35(local_608.data._M_elems[9]._1_3_,local_608.data._M_elems._32_5_) >>
                     0x20);
          local_688.exp = local_608.exp;
          local_688.neg = local_608.neg;
          local_688.fpclass = local_608.fpclass;
          local_688.prec_elem = local_608.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_688,&local_588);
          pnVar10 = (local_610->colWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
          *(undefined8 *)puVar2 = local_688.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_688.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
          *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
          *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
               CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
          *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_688.exp;
          *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_688.neg;
          *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_688._48_8_;
          (local_610->colUp).data[uVar13 - 2] = false;
        }
        else {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar17);
          pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 10;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems._24_5_ = 0;
          local_2b8.data._M_elems[7]._1_3_ = 0;
          local_2b8.data._M_elems._32_5_ = 0;
          local_2b8.data._M_elems[9]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          if (pcVar15 == &local_2b8) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_2b8,pcVar11);
            if (local_2b8.data._M_elems[0] != 0 || local_2b8.fpclass != cpp_dec_float_finite) {
              local_2b8.neg = (bool)(local_2b8.neg ^ 1);
            }
          }
          else {
            if (pcVar11 != &local_2b8) {
              uVar12 = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18);
              local_2b8.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_2b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_2b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
              local_2b8.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x30);
              local_2b8.data._M_elems._16_8_ =
                   *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              uVar12 = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x20);
              local_2b8.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_2b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_2b8.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10);
              local_2b8.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc);
              local_2b8._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_2b8,pcVar15);
          }
          local_688.data._M_elems[8] = local_2b8.data._M_elems[8];
          local_688.data._M_elems[9] =
               (uint)(CONCAT35(local_2b8.data._M_elems[9]._1_3_,local_2b8.data._M_elems._32_5_) >>
                     0x20);
          local_688.data._M_elems[4] = local_2b8.data._M_elems[4];
          local_688.data._M_elems[5] = local_2b8.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_2b8.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_2b8.data._M_elems[7]._1_3_;
          local_688.data._M_elems[0] = local_2b8.data._M_elems[0];
          local_688.data._M_elems[1] = local_2b8.data._M_elems[1];
          uVar12 = local_688.data._M_elems._0_8_;
          local_688.data._M_elems[2] = local_2b8.data._M_elems[2];
          local_688.data._M_elems[3] = local_2b8.data._M_elems[3];
          local_688.exp = local_2b8.exp;
          local_688.neg = local_2b8.neg;
          local_688.fpclass = local_2b8.fpclass;
          local_688.prec_elem = local_2b8.prec_elem;
          if ((local_2b8.neg == true) &&
             (local_688.data._M_elems[0] = local_2b8.data._M_elems[0],
             local_688.data._M_elems[0] != 0 || local_2b8.fpclass != cpp_dec_float_finite)) {
            local_688.neg = false;
          }
          local_688.data._M_elems._0_8_ = uVar12;
          if (((local_2b8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_38 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_688,(cpp_dec_float<50U,_int,_void> *)local_68), -1 < iVar9))
          {
            pnVar10 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_688.fpclass = cpp_dec_float_finite;
            local_688.prec_elem = 10;
            local_688.data._M_elems[0] = 0;
            local_688.data._M_elems[1] = 0;
            local_688.data._M_elems[2] = 0;
            local_688.data._M_elems[3] = 0;
            local_688.data._M_elems[4] = 0;
            local_688.data._M_elems[5] = 0;
            local_688.data._M_elems._24_5_ = 0;
            local_688.data._M_elems[7]._1_3_ = 0;
            local_688.data._M_elems[8] = 0;
            local_688.data._M_elems[9] = 0;
            local_688.exp = 0;
            local_688.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_688,local_188);
            if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) != 2) &&
                (local_688.fpclass != cpp_dec_float_NaN)) &&
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)&pnVar10[-1].m_backend.data + lVar17),&local_688),
               0 < iVar9)) {
              if (local_508.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_688,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_508,&local_688);
                if (0 < iVar9) {
                  local_648.data._M_elems[8] = local_1c0.data._M_elems[8];
                  local_648.data._M_elems[9] = local_1c0.data._M_elems[9];
                  local_648.data._M_elems[4] = local_1c0.data._M_elems[4];
                  local_648.data._M_elems[5] = local_1c0.data._M_elems[5];
                  local_648.data._M_elems[6] = local_1c0.data._M_elems[6];
                  local_648.data._M_elems[7] = local_1c0.data._M_elems[7];
                  local_648.data._M_elems[0] = local_1c0.data._M_elems[0];
                  local_648.data._M_elems[1] = local_1c0.data._M_elems[1];
                  local_648.data._M_elems[2] = local_1c0.data._M_elems[2];
                  local_648.data._M_elems[3] = local_1c0.data._M_elems[3];
                  local_648.exp = local_1c0.exp;
                  local_648.neg = local_1c0.neg;
                  local_648.fpclass = local_1c0.fpclass;
                  local_648.prec_elem = local_1c0.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_648,&local_508);
                  local_608.data._M_elems[0] = local_648.data._M_elems[0];
                  local_608.data._M_elems[1] = local_648.data._M_elems[1];
                  local_608.data._M_elems[2] = local_648.data._M_elems[2];
                  local_608.data._M_elems[3] = local_648.data._M_elems[3];
                  local_608.data._M_elems[4] = local_648.data._M_elems[4];
                  local_608.data._M_elems[5] = local_648.data._M_elems[5];
                  local_608.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
                  local_608.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
                  local_608.data._M_elems._32_5_ = local_648.data._M_elems._32_5_;
                  local_608.data._M_elems[9]._1_3_ = local_648.data._M_elems[9]._1_3_;
                  local_608.exp = local_648.exp;
                  local_608.neg = local_648.neg;
                  local_608.fpclass = local_648.fpclass;
                  local_608.prec_elem = local_648.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_608,&local_488);
                  goto LAB_00340cf4;
                }
              }
              local_648.data._M_elems[8] = local_1c0.data._M_elems[8];
              local_648.data._M_elems[9] = local_1c0.data._M_elems[9];
              local_648.data._M_elems[0] = local_1c0.data._M_elems[0];
              local_648.data._M_elems[1] = local_1c0.data._M_elems[1];
              local_648.data._M_elems[2] = local_1c0.data._M_elems[2];
              local_648.data._M_elems[3] = local_1c0.data._M_elems[3];
              local_648.data._M_elems[4] = local_1c0.data._M_elems[4];
              local_648.data._M_elems[5] = local_1c0.data._M_elems[5];
              local_648.data._M_elems[6] = local_1c0.data._M_elems[6];
              local_648.data._M_elems[7] = local_1c0.data._M_elems[7];
              local_648.exp = local_1c0.exp;
              local_648.neg = local_1c0.neg;
              local_648._48_8_ = local_1c0._48_8_;
              goto LAB_003406e3;
            }
            local_648.data._M_elems[8] = local_330.data._M_elems[8];
            local_648.data._M_elems[9] = local_330.data._M_elems[9];
            local_648.data._M_elems[4] = local_330.data._M_elems[4];
            local_648.data._M_elems[5] = local_330.data._M_elems[5];
            local_648.data._M_elems[6] = local_330.data._M_elems[6];
            local_648.data._M_elems[7] = local_330.data._M_elems[7];
            local_648.data._M_elems[0] = local_330.data._M_elems[0];
            local_648.data._M_elems[1] = local_330.data._M_elems[1];
            local_648.data._M_elems[2] = local_330.data._M_elems[2];
            local_648.data._M_elems[3] = local_330.data._M_elems[3];
            local_648.exp = local_330.exp;
            local_648.neg = local_330.neg;
            local_648.fpclass = local_330.fpclass;
            local_648.prec_elem = local_330.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_648,&local_488);
            local_608.data._M_elems[0] = local_648.data._M_elems[0];
            local_608.data._M_elems[1] = local_648.data._M_elems[1];
            local_608.data._M_elems[2] = local_648.data._M_elems[2];
            local_608.data._M_elems[3] = local_648.data._M_elems[3];
            local_608.data._M_elems[4] = local_648.data._M_elems[4];
            local_608.data._M_elems[5] = local_648.data._M_elems[5];
            local_608.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
            local_608.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
            local_608.data._M_elems._32_5_ = local_648.data._M_elems._32_5_;
            local_608.data._M_elems[9]._1_3_ = local_648.data._M_elems[9]._1_3_;
            local_608.exp = local_648.exp;
            local_608.neg = local_648.neg;
            local_608.fpclass = local_648.fpclass;
            local_608.prec_elem = local_648.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_608,&local_508);
LAB_00340cf4:
            local_688.data._M_elems[0] = local_608.data._M_elems[0];
            local_688.data._M_elems[1] = local_608.data._M_elems[1];
            local_688.data._M_elems[2] = local_608.data._M_elems[2];
            local_688.data._M_elems[3] = local_608.data._M_elems[3];
            local_688.data._M_elems[4] = local_608.data._M_elems[4];
            local_688.data._M_elems[5] = local_608.data._M_elems[5];
            local_688.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
            local_688.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
            local_688.data._M_elems[8] = local_608.data._M_elems[8];
            local_688.data._M_elems[9] =
                 (uint)(CONCAT35(local_608.data._M_elems[9]._1_3_,local_608.data._M_elems._32_5_) >>
                       0x20);
            local_688.exp = local_608.exp;
            local_688.neg = local_608.neg;
            local_688.fpclass = local_608.fpclass;
            local_688.prec_elem = local_608.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_688,&local_588);
            pnVar10 = (local_610->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_688.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_688.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
            *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
            *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                 CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
            *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_688.exp;
            *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_688.neg;
            *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_688._48_8_;
            (local_610->colUp).data[uVar13 - 2] = true;
          }
          else {
            local_608.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
            local_608.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
            local_608.data._M_elems[4] = local_f8.data._M_elems[4];
            local_608.data._M_elems[5] = local_f8.data._M_elems[5];
            local_608.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
            local_608.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
            local_608.data._M_elems[0] = local_f8.data._M_elems[0];
            local_608.data._M_elems[1] = local_f8.data._M_elems[1];
            local_608.data._M_elems[2] = local_f8.data._M_elems[2];
            local_608.data._M_elems[3] = local_f8.data._M_elems[3];
            local_608.exp = local_f8.exp;
            local_608.neg = local_f8.neg;
            local_608.fpclass = local_f8.fpclass;
            local_608.prec_elem = local_f8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_608,&local_588);
            local_648.data._M_elems[9]._1_3_ = local_508.data._M_elems[9]._1_3_;
            local_648.data._M_elems._32_5_ = local_508.data._M_elems._32_5_;
            local_648.data._M_elems[7]._1_3_ = local_508.data._M_elems[7]._1_3_;
            local_648.data._M_elems._24_5_ = local_508.data._M_elems._24_5_;
            local_648.data._M_elems[4] = local_508.data._M_elems[4];
            local_648.data._M_elems[5] = local_508.data._M_elems[5];
            local_648.data._M_elems[0] = local_508.data._M_elems[0];
            local_648.data._M_elems[1] = local_508.data._M_elems[1];
            uVar12 = local_648.data._M_elems._0_8_;
            local_648.data._M_elems[2] = local_508.data._M_elems[2];
            local_648.data._M_elems[3] = local_508.data._M_elems[3];
            local_648.exp = local_508.exp;
            local_648.neg = local_508.neg;
            local_648.fpclass = local_508.fpclass;
            local_648.prec_elem = local_508.prec_elem;
            if ((local_508.neg == true) &&
               (local_648.data._M_elems[0] = local_508.data._M_elems[0],
               local_508.fpclass != cpp_dec_float_finite || local_648.data._M_elems[0] != 0)) {
              local_648.neg = false;
            }
            local_688.data._M_elems[8] = local_608.data._M_elems[8];
            local_688.data._M_elems[9] =
                 (uint)(CONCAT35(local_608.data._M_elems[9]._1_3_,local_608.data._M_elems._32_5_) >>
                       0x20);
            local_688.data._M_elems[4] = local_608.data._M_elems[4];
            local_688.data._M_elems[5] = local_608.data._M_elems[5];
            local_688.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
            local_688.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
            local_688.data._M_elems[0] = local_608.data._M_elems[0];
            local_688.data._M_elems[1] = local_608.data._M_elems[1];
            local_688.data._M_elems[2] = local_608.data._M_elems[2];
            local_688.data._M_elems[3] = local_608.data._M_elems[3];
            local_688.exp = local_608.exp;
            local_688.neg = local_608.neg;
            local_688.fpclass = local_608.fpclass;
            local_688.prec_elem = local_608.prec_elem;
            local_648.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_688,&local_648);
LAB_0034092f:
            pnVar10 = (local_610->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_688.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_688.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
            *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
            *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                 CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
            *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_688.exp;
            *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_688.neg;
            *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_688._48_8_;
          }
        }
        uVar13 = uVar13 - 1;
        lVar17 = lVar17 + -0x38;
      } while (1 < uVar13);
    }
    local_408 = (double)(long)(base->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
    if (0 < (long)local_408) {
      local_188 = *(double *)(in_FS_OFFSET + -8);
      uStack_180 = 0;
      local_78 = -local_188;
      uStack_70 = 0x8000000000000000;
      local_80 = base;
      do {
        lVar16 = (long)local_408 + -1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_508,1,(type *)0x0);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_488,0,(type *)0x0);
        local_688.data._M_elems[8] = local_3e8.data._M_elems[8];
        local_688.data._M_elems[9] =
             (uint)(CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_) >>
                   0x20);
        local_688.data._M_elems[4] = local_3e8.data._M_elems[4];
        local_688.data._M_elems[5] = local_3e8.data._M_elems[5];
        local_688.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
        local_688.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
        local_688.data._M_elems[0] = local_3e8.data._M_elems[0];
        local_688.data._M_elems[1] = local_3e8.data._M_elems[1];
        local_688.data._M_elems[2] = local_3e8.data._M_elems[2];
        local_688.data._M_elems[3] = local_3e8.data._M_elems[3];
        local_688.exp = local_3e8.exp;
        local_688.neg = local_3e8.neg;
        local_688.fpclass = local_3e8.fpclass;
        local_688.prec_elem = local_3e8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_688,&local_508);
        pcVar11 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
        local_5c8.fpclass = cpp_dec_float_finite;
        local_5c8.prec_elem = 10;
        local_5c8.data._M_elems._32_5_ = 0;
        local_5c8.data._M_elems[9]._1_3_ = 0;
        local_5c8.exp = 0;
        local_5c8.neg = false;
        local_5c8.data._M_elems[4] = 0;
        local_5c8.data._M_elems[5] = 0;
        local_5c8.data._M_elems._24_5_ = 0;
        local_5c8.data._M_elems[7]._1_3_ = 0;
        local_5c8.data._M_elems._0_16_ = ZEXT816(0);
        pcVar15 = &local_688;
        if (&local_5c8 != pcVar11) {
          local_5c8.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]),0);
          local_5c8.data._M_elems[9]._1_3_ = (undefined3)(local_688.data._M_elems[9] >> 8);
          local_5c8.data._M_elems[4] = local_688.data._M_elems[4];
          local_5c8.data._M_elems[5] = local_688.data._M_elems[5];
          local_5c8.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
          local_5c8.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
          local_5c8.data._M_elems[2] = local_688.data._M_elems[2];
          local_5c8.data._M_elems[3] = local_688.data._M_elems[3];
          local_5c8.data._M_elems[0] = local_688.data._M_elems[0];
          local_5c8.data._M_elems[1] = local_688.data._M_elems[1];
          local_5c8.exp = local_688.exp;
          local_5c8.neg = local_688.neg;
          local_5c8.fpclass = local_688.fpclass;
          local_5c8.prec_elem = local_688.prec_elem;
          pcVar15 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_5c8,pcVar15);
        local_688.data._M_elems[8] = local_3e8.data._M_elems[8];
        local_688.data._M_elems[9] =
             (uint)(CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_) >>
                   0x20);
        local_688.data._M_elems[4] = local_3e8.data._M_elems[4];
        local_688.data._M_elems[5] = local_3e8.data._M_elems[5];
        local_688.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
        local_688.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
        local_688.data._M_elems[0] = local_3e8.data._M_elems[0];
        local_688.data._M_elems[1] = local_3e8.data._M_elems[1];
        local_688.data._M_elems[2] = local_3e8.data._M_elems[2];
        local_688.data._M_elems[3] = local_3e8.data._M_elems[3];
        local_688.exp = local_3e8.exp;
        local_688.neg = local_3e8.neg;
        local_688.fpclass = local_3e8.fpclass;
        local_688.prec_elem = local_3e8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_688,&local_508);
        pcVar11 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
        local_608.fpclass = cpp_dec_float_finite;
        local_608.prec_elem = 10;
        local_608.data._M_elems._32_5_ = 0;
        local_608.data._M_elems[9]._1_3_ = 0;
        local_608.exp = 0;
        local_608.neg = false;
        local_608.data._M_elems[4] = 0;
        local_608.data._M_elems[5] = 0;
        local_608.data._M_elems._24_5_ = 0;
        local_608.data._M_elems[7]._1_3_ = 0;
        local_608.data._M_elems[0] = 0;
        local_608.data._M_elems[1] = 0;
        local_608.data._M_elems[2] = 0;
        local_608.data._M_elems[3] = 0;
        pcVar15 = &local_688;
        if (&local_608 != pcVar11) {
          local_608.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]),0);
          local_608.data._M_elems[9]._1_3_ = (undefined3)(local_688.data._M_elems[9] >> 8);
          local_608.data._M_elems[4] = local_688.data._M_elems[4];
          local_608.data._M_elems[5] = local_688.data._M_elems[5];
          local_608.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
          local_608.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
          local_608.data._M_elems[0] = local_688.data._M_elems[0];
          local_608.data._M_elems[1] = local_688.data._M_elems[1];
          local_608.data._M_elems[2] = local_688.data._M_elems[2];
          local_608.data._M_elems[3] = local_688.data._M_elems[3];
          local_608.exp = local_688.exp;
          local_608.neg = local_688.neg;
          local_608.fpclass = local_688.fpclass;
          local_608.prec_elem = local_688.prec_elem;
          pcVar15 = pcVar11;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_608,pcVar15);
        auVar6 = (undefined1  [16])local_448.data._M_elems._0_16_;
        local_648.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
        local_648.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
        local_648.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
        local_648.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
        local_648.data._M_elems[4] = local_448.data._M_elems[4];
        local_648.data._M_elems[5] = local_448.data._M_elems[5];
        local_648.data._M_elems[0] = local_448.data._M_elems[0];
        local_648.data._M_elems[1] = local_448.data._M_elems[1];
        local_648.data._M_elems[2] = local_448.data._M_elems[2];
        local_648.data._M_elems[3] = local_448.data._M_elems[3];
        local_648.exp = local_448.exp;
        local_648.neg = local_448.neg;
        local_648.fpclass = local_448.fpclass;
        local_648.prec_elem = local_448.prec_elem;
        local_448.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_648,&local_508);
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar9 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar16].idx;
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems[0] = 0;
        local_688.data._M_elems[1] = 0;
        local_688.data._M_elems[2] = 0;
        local_688.data._M_elems[3] = 0;
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems[8] = 0;
        local_688.data._M_elems[9] = 0;
        local_688.exp = 0;
        local_688.neg = false;
        lVar17 = (long)pIVar4[iVar9].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar17) {
          uVar13 = lVar17 + 1;
          lVar17 = lVar17 * 0x3c;
          do {
            pNVar5 = pIVar4[iVar9].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&pNVar5[-1].val.m_backend.data + lVar17);
            pcVar11 = &(local_3f8->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar5[-1].val + 1) + lVar17)].m_backend;
            local_588.fpclass = cpp_dec_float_finite;
            local_588.prec_elem = 10;
            local_588.data._M_elems[0] = 0;
            local_588.data._M_elems[1] = 0;
            local_588.data._M_elems[2] = 0;
            local_588.data._M_elems[3] = 0;
            local_588.data._M_elems[4] = 0;
            local_588.data._M_elems[5] = 0;
            local_588.data._M_elems._24_5_ = 0;
            local_588.data._M_elems[7]._1_3_ = 0;
            local_588.data._M_elems[8] = 0;
            local_588.data._M_elems[9] = 0;
            local_588.exp = 0;
            local_588.neg = false;
            pcVar15 = pcVar11;
            if ((pcVar14 != &local_588) && (pcVar15 = pcVar14, &local_588 != pcVar11)) {
              local_588.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_588.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_588.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_588.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_588.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_588.exp = pcVar11->exp;
              local_588.neg = pcVar11->neg;
              local_588.fpclass = pcVar11->fpclass;
              local_588.prec_elem = pcVar11->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_588,pcVar15);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_688,&local_588);
            uVar13 = uVar13 - 1;
            base = local_80;
            lVar17 = lVar17 + -0x3c;
          } while (1 < uVar13);
        }
        auVar6 = (undefined1  [16])local_688.data._M_elems._0_16_;
        local_548.data._M_elems[9] = local_688.data._M_elems[9];
        local_548.data._M_elems[8] = local_688.data._M_elems[8];
        local_548.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
        local_548.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
        local_548.data._M_elems[4] = local_688.data._M_elems[4];
        local_548.data._M_elems[5] = local_688.data._M_elems[5];
        local_548.data._M_elems[0] = local_688.data._M_elems[0];
        local_548.data._M_elems[1] = local_688.data._M_elems[1];
        local_548.data._M_elems[2] = local_688.data._M_elems[2];
        local_548.data._M_elems[3] = local_688.data._M_elems[3];
        local_588.data._M_elems[2] = local_648.data._M_elems[2];
        local_588.data._M_elems[3] = local_648.data._M_elems[3];
        local_588.data._M_elems[0] = local_648.data._M_elems[0];
        local_588.data._M_elems[1] = local_648.data._M_elems[1];
        local_588.data._M_elems[4] = local_648.data._M_elems[4];
        local_588.data._M_elems[5] = local_648.data._M_elems[5];
        local_588.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
        local_588.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
        local_588.data._M_elems[8] = local_648.data._M_elems[8];
        local_588.data._M_elems[9] = local_648.data._M_elems[9];
        local_588.exp = local_648.exp;
        local_588.neg = local_648.neg;
        local_588.fpclass = local_648.fpclass;
        local_588.prec_elem = local_648.prec_elem;
        local_688.data._M_elems._0_16_ = auVar6;
        local_548.exp = local_688.exp;
        local_548.neg = local_688.neg;
        local_548._48_8_ = local_688._48_8_;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_588,&local_548);
        pcVar15 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
        ::soplex::infinity::__tls_init();
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems._0_16_ = ZEXT816(0);
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems[8] = 0;
        local_688.data._M_elems[9] = 0;
        local_688.exp = 0;
        local_688.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_688,local_188);
        if (((pcVar15->fpclass == cpp_dec_float_NaN) || (local_688.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar15,&local_688), -1 < iVar9)) {
          pcVar15 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
          ::soplex::infinity::__tls_init();
          local_688.fpclass = cpp_dec_float_finite;
          local_688.prec_elem = 10;
          local_688.data._M_elems._0_16_ = ZEXT816(0);
          local_688.data._M_elems[4] = 0;
          local_688.data._M_elems[5] = 0;
          local_688.data._M_elems._24_5_ = 0;
          local_688.data._M_elems[7]._1_3_ = 0;
          local_688.data._M_elems[8] = 0;
          local_688.data._M_elems[9] = 0;
          local_688.exp = 0;
          local_688.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_688,local_78);
          if (((pcVar15->fpclass == cpp_dec_float_NaN) || (local_688.fpclass == cpp_dec_float_NaN))
             || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar15,&local_688), iVar9 < 1)) {
            auVar6 = (undefined1  [16])local_4c8.data._M_elems._0_16_;
            local_648.data._M_elems[9]._1_3_ = local_4c8.data._M_elems[9]._1_3_;
            local_648.data._M_elems._32_5_ = local_4c8.data._M_elems._32_5_;
            local_648.data._M_elems[7]._1_3_ = local_4c8.data._M_elems[7]._1_3_;
            local_648.data._M_elems._24_5_ = local_4c8.data._M_elems._24_5_;
            local_648.data._M_elems[4] = local_4c8.data._M_elems[4];
            local_648.data._M_elems[5] = local_4c8.data._M_elems[5];
            local_648.data._M_elems[0] = local_4c8.data._M_elems[0];
            local_648.data._M_elems[1] = local_4c8.data._M_elems[1];
            local_648.data._M_elems[2] = local_4c8.data._M_elems[2];
            local_648.data._M_elems[3] = local_4c8.data._M_elems[3];
            local_648.exp = local_4c8.exp;
            local_648.neg = local_4c8.neg;
            local_648.fpclass = local_4c8.fpclass;
            local_648.prec_elem = local_4c8.prec_elem;
            local_4c8.data._M_elems._0_16_ = auVar6;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_648,&local_488);
            auVar6 = (undefined1  [16])local_588.data._M_elems._0_16_;
            local_548.data._M_elems[8] = local_588.data._M_elems[8];
            local_548.data._M_elems[9] = local_588.data._M_elems[9];
            local_548.data._M_elems[7]._1_3_ = local_588.data._M_elems[7]._1_3_;
            local_548.data._M_elems._24_5_ = local_588.data._M_elems._24_5_;
            local_548.data._M_elems[4] = local_588.data._M_elems[4];
            local_548.data._M_elems[5] = local_588.data._M_elems[5];
            local_548.data._M_elems[0] = local_588.data._M_elems[0];
            local_548.data._M_elems[1] = local_588.data._M_elems[1];
            uVar12 = local_548.data._M_elems._0_8_;
            local_548.data._M_elems[2] = local_588.data._M_elems[2];
            local_548.data._M_elems[3] = local_588.data._M_elems[3];
            local_548.exp = local_588.exp;
            local_548.neg = local_588.neg;
            local_548.fpclass = local_588.fpclass;
            local_548.prec_elem = local_588.prec_elem;
            if ((local_588.neg == true) &&
               (local_548.data._M_elems[0] = auVar6._0_4_,
               local_588.fpclass != cpp_dec_float_finite || local_548.data._M_elems[0] != 0)) {
              local_548.neg = false;
            }
            local_688.data._M_elems[8] = local_648.data._M_elems[8];
            local_688.data._M_elems[9] = local_648.data._M_elems[9];
            local_688.data._M_elems[4] = local_648.data._M_elems[4];
            local_688.data._M_elems[5] = local_648.data._M_elems[5];
            local_688.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
            local_688.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
            local_688.data._M_elems[0] = local_648.data._M_elems[0];
            local_688.data._M_elems[1] = local_648.data._M_elems[1];
            local_688.data._M_elems[2] = local_648.data._M_elems[2];
            local_688.data._M_elems[3] = local_648.data._M_elems[3];
            local_688.exp = local_648.exp;
            local_688.neg = local_648.neg;
            local_688.fpclass = local_648.fpclass;
            local_688.prec_elem = local_648.prec_elem;
            local_588.data._M_elems._0_16_ = auVar6;
            local_548.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_688,&local_548);
            goto LAB_00341716;
          }
          local_548.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
          local_548.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
          local_548.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
          local_548.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
          local_548.data._M_elems[4] = local_1f8.data._M_elems[4];
          local_548.data._M_elems[5] = local_1f8.data._M_elems[5];
          local_548.data._M_elems[0] = local_1f8.data._M_elems[0];
          local_548.data._M_elems[1] = local_1f8.data._M_elems[1];
          local_548.data._M_elems[2] = local_1f8.data._M_elems[2];
          local_548.data._M_elems[3] = local_1f8.data._M_elems[3];
          local_548.exp = local_1f8.exp;
          local_548.neg = local_1f8.neg;
          local_548.fpclass = local_1f8.fpclass;
          local_548.prec_elem = local_1f8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_548,&local_608);
          local_648.data._M_elems[0] = local_548.data._M_elems[0];
          local_648.data._M_elems[1] = local_548.data._M_elems[1];
          local_648.data._M_elems[2] = local_548.data._M_elems[2];
          local_648.data._M_elems[3] = local_548.data._M_elems[3];
          local_648.data._M_elems[4] = local_548.data._M_elems[4];
          local_648.data._M_elems[5] = local_548.data._M_elems[5];
          local_648.data._M_elems[6] = local_548.data._M_elems[6];
          local_648.data._M_elems[7] = local_548.data._M_elems[7];
          local_648.data._M_elems[8] = local_548.data._M_elems[8];
          local_648.data._M_elems[9] = local_548.data._M_elems[9];
          local_648.exp = local_548.exp;
          local_648.neg = local_548.neg;
          local_648.fpclass = local_548.fpclass;
          local_648.prec_elem = local_548.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_648,&local_488);
          local_688.data._M_elems[0] = local_648.data._M_elems[0];
          local_688.data._M_elems[1] = local_648.data._M_elems[1];
          local_688.data._M_elems[2] = local_648.data._M_elems[2];
          local_688.data._M_elems[3] = local_648.data._M_elems[3];
          local_688.data._M_elems[4] = local_648.data._M_elems[4];
          local_688.data._M_elems[5] = local_648.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
          local_688.data._M_elems[8] = local_648.data._M_elems[8];
          local_688.data._M_elems[9] = local_648.data._M_elems[9];
          local_688.exp = local_648.exp;
          local_688.neg = local_648.neg;
          local_688.fpclass = local_648.fpclass;
          local_688.prec_elem = local_648.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_688,&local_588);
LAB_003415a2:
          pnVar10 = (local_610->rowWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar10[lVar16].m_backend.data = local_688.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar10[lVar16].m_backend.data + 8) = local_688.data._M_elems._8_8_
          ;
          puVar2 = (uint *)((long)&pnVar10[lVar16].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar10[lVar16].m_backend.data + 0x20) =
               CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
          pnVar10[lVar16].m_backend.exp = local_688.exp;
          pnVar10[lVar16].m_backend.neg = local_688.neg;
          pnVar10[lVar16].m_backend.fpclass = local_688.fpclass;
          pnVar10[lVar16].m_backend.prec_elem = local_688.prec_elem;
          (local_610->rowRight).data[lVar16] = false;
        }
        else {
          pcVar15 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
          pcVar11 = &(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
          local_2f8.fpclass = cpp_dec_float_finite;
          local_2f8.prec_elem = 10;
          local_2f8.data._M_elems[0] = 0;
          local_2f8.data._M_elems[1] = 0;
          local_2f8.data._M_elems[2] = 0;
          local_2f8.data._M_elems[3] = 0;
          local_2f8.data._M_elems[4] = 0;
          local_2f8.data._M_elems[5] = 0;
          local_2f8.data._M_elems._24_5_ = 0;
          local_2f8.data._M_elems[7]._1_3_ = 0;
          local_2f8.data._M_elems._32_5_ = 0;
          local_2f8.data._M_elems[9]._1_3_ = 0;
          local_2f8.exp = 0;
          local_2f8.neg = false;
          if (&local_2f8 == pcVar11) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_2f8,pcVar15);
            if (local_2f8.data._M_elems[0] != 0 || local_2f8.fpclass != cpp_dec_float_finite) {
              local_2f8.neg = (bool)(local_2f8.neg ^ 1);
            }
          }
          else {
            if (&local_2f8 != pcVar15) {
              uVar12 = *(undefined8 *)((pcVar15->data)._M_elems + 8);
              local_2f8.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_2f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_2f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar15->data)._M_elems;
              local_2f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 2);
              local_2f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar15->data)._M_elems + 4);
              uVar12 = *(undefined8 *)((pcVar15->data)._M_elems + 6);
              local_2f8.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_2f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_2f8.exp = pcVar15->exp;
              local_2f8.neg = pcVar15->neg;
              local_2f8.fpclass = pcVar15->fpclass;
              local_2f8.prec_elem = pcVar15->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_2f8,pcVar11);
          }
          local_688.data._M_elems[8] = local_2f8.data._M_elems[8];
          local_688.data._M_elems[9] =
               (uint)(CONCAT35(local_2f8.data._M_elems[9]._1_3_,local_2f8.data._M_elems._32_5_) >>
                     0x20);
          local_688.data._M_elems[4] = local_2f8.data._M_elems[4];
          local_688.data._M_elems[5] = local_2f8.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_2f8.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_2f8.data._M_elems[7]._1_3_;
          local_688.data._M_elems[0] = local_2f8.data._M_elems[0];
          local_688.data._M_elems[1] = local_2f8.data._M_elems[1];
          uVar12 = local_688.data._M_elems._0_8_;
          local_688.data._M_elems[2] = local_2f8.data._M_elems[2];
          local_688.data._M_elems[3] = local_2f8.data._M_elems[3];
          local_688.exp = local_2f8.exp;
          local_688.neg = local_2f8.neg;
          local_688.fpclass = local_2f8.fpclass;
          local_688.prec_elem = local_2f8.prec_elem;
          if ((local_2f8.neg == true) &&
             (local_688.data._M_elems[0] = local_2f8.data._M_elems[0],
             local_688.data._M_elems[0] != 0 || local_2f8.fpclass != cpp_dec_float_finite)) {
            local_688.neg = false;
          }
          local_688.data._M_elems._0_8_ = uVar12;
          if (((local_2f8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_38 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_688,(cpp_dec_float<50U,_int,_void> *)local_68), -1 < iVar9))
          {
            pcVar15 = &(base->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16].m_backend;
            ::soplex::infinity::__tls_init();
            local_688.fpclass = cpp_dec_float_finite;
            local_688.prec_elem = 10;
            local_688.data._M_elems[0] = 0;
            local_688.data._M_elems[1] = 0;
            local_688.data._M_elems[2] = 0;
            local_688.data._M_elems[3] = 0;
            local_688.data._M_elems[4] = 0;
            local_688.data._M_elems[5] = 0;
            local_688.data._M_elems._24_5_ = 0;
            local_688.data._M_elems[7]._1_3_ = 0;
            local_688.data._M_elems[8] = 0;
            local_688.data._M_elems[9] = 0;
            local_688.exp = 0;
            local_688.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_688,local_78);
            if (((pcVar15->fpclass != cpp_dec_float_NaN) && (local_688.fpclass != cpp_dec_float_NaN)
                ) && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(pcVar15,&local_688), 0 < iVar9)) {
              if (local_588.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_688,0,(type *)0x0);
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_588,&local_688);
                if (0 < iVar9) {
                  local_548.data._M_elems[9]._1_3_ = local_368.data._M_elems[9]._1_3_;
                  local_548.data._M_elems._32_5_ = local_368.data._M_elems._32_5_;
                  local_548.data._M_elems[7]._1_3_ = local_368.data._M_elems[7]._1_3_;
                  local_548.data._M_elems._24_5_ = local_368.data._M_elems._24_5_;
                  local_548.data._M_elems[4] = local_368.data._M_elems[4];
                  local_548.data._M_elems[5] = local_368.data._M_elems[5];
                  local_548.data._M_elems[0] = local_368.data._M_elems[0];
                  local_548.data._M_elems[1] = local_368.data._M_elems[1];
                  local_548.data._M_elems[2] = local_368.data._M_elems[2];
                  local_548.data._M_elems[3] = local_368.data._M_elems[3];
                  local_548.exp = local_368.exp;
                  local_548.neg = local_368.neg;
                  local_548.fpclass = local_368.fpclass;
                  local_548.prec_elem = local_368.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_548,&local_588);
                  local_648.data._M_elems[0] = local_548.data._M_elems[0];
                  local_648.data._M_elems[1] = local_548.data._M_elems[1];
                  local_648.data._M_elems[2] = local_548.data._M_elems[2];
                  local_648.data._M_elems[3] = local_548.data._M_elems[3];
                  local_648.data._M_elems[4] = local_548.data._M_elems[4];
                  local_648.data._M_elems[5] = local_548.data._M_elems[5];
                  local_648.data._M_elems[6] = local_548.data._M_elems[6];
                  local_648.data._M_elems[7] = local_548.data._M_elems[7];
                  local_648.data._M_elems[8] = local_548.data._M_elems[8];
                  local_648.data._M_elems[9] = local_548.data._M_elems[9];
                  local_648.exp = local_548.exp;
                  local_648.neg = local_548.neg;
                  local_648.fpclass = local_548.fpclass;
                  local_648.prec_elem = local_548.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_648,&local_5c8);
                  local_688.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
                  local_688.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
                  local_688.data._M_elems[8] = local_648.data._M_elems[8];
                  local_688.data._M_elems[9] = local_648.data._M_elems[9];
                  pcVar15 = &local_488;
                  goto LAB_00341b6d;
                }
              }
              local_548.data._M_elems[9]._1_3_ = local_368.data._M_elems[9]._1_3_;
              local_548.data._M_elems._32_5_ = local_368.data._M_elems._32_5_;
              local_548.data._M_elems[7]._1_3_ = local_368.data._M_elems[7]._1_3_;
              local_548.data._M_elems._24_5_ = local_368.data._M_elems._24_5_;
              local_548.data._M_elems[4] = local_368.data._M_elems[4];
              local_548.data._M_elems[5] = local_368.data._M_elems[5];
              local_548.data._M_elems[0] = local_368.data._M_elems[0];
              local_548.data._M_elems[1] = local_368.data._M_elems[1];
              local_548.data._M_elems[2] = local_368.data._M_elems[2];
              local_548.data._M_elems[3] = local_368.data._M_elems[3];
              local_548.exp = local_368.exp;
              local_548.neg = local_368.neg;
              local_548.fpclass = local_368.fpclass;
              local_548.prec_elem = local_368.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_548,&local_588);
              local_648.data._M_elems[0] = local_548.data._M_elems[0];
              local_648.data._M_elems[1] = local_548.data._M_elems[1];
              local_648.data._M_elems[2] = local_548.data._M_elems[2];
              local_648.data._M_elems[3] = local_548.data._M_elems[3];
              local_648.data._M_elems[4] = local_548.data._M_elems[4];
              local_648.data._M_elems[5] = local_548.data._M_elems[5];
              local_648.data._M_elems[6] = local_548.data._M_elems[6];
              local_648.data._M_elems[7] = local_548.data._M_elems[7];
              local_648.data._M_elems[8] = local_548.data._M_elems[8];
              local_648.data._M_elems[9] = local_548.data._M_elems[9];
              local_648.exp = local_548.exp;
              local_648.neg = local_548.neg;
              local_648.fpclass = local_548.fpclass;
              local_648.prec_elem = local_548.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_648,&local_608);
              local_688.data._M_elems[0] = local_648.data._M_elems[0];
              local_688.data._M_elems[1] = local_648.data._M_elems[1];
              local_688.data._M_elems[2] = local_648.data._M_elems[2];
              local_688.data._M_elems[3] = local_648.data._M_elems[3];
              local_688.data._M_elems[4] = local_648.data._M_elems[4];
              local_688.data._M_elems[5] = local_648.data._M_elems[5];
              local_688.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
              local_688.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
              local_688.data._M_elems[8] = local_648.data._M_elems[8];
              local_688.data._M_elems[9] = local_648.data._M_elems[9];
              local_688.exp = local_648.exp;
              local_688.neg = local_648.neg;
              local_688.fpclass = local_648.fpclass;
              local_688.prec_elem = local_648.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_688,&local_488);
              goto LAB_003415a2;
            }
            local_548.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
            local_548.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
            local_548.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
            local_548.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
            local_548.data._M_elems[4] = local_1f8.data._M_elems[4];
            local_548.data._M_elems[5] = local_1f8.data._M_elems[5];
            local_548.data._M_elems[0] = local_1f8.data._M_elems[0];
            local_548.data._M_elems[1] = local_1f8.data._M_elems[1];
            local_548.data._M_elems[2] = local_1f8.data._M_elems[2];
            local_548.data._M_elems[3] = local_1f8.data._M_elems[3];
            local_548.exp = local_1f8.exp;
            local_548.neg = local_1f8.neg;
            local_548.fpclass = local_1f8.fpclass;
            local_548.prec_elem = local_1f8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_548,&local_5c8);
            local_648.data._M_elems[0] = local_548.data._M_elems[0];
            local_648.data._M_elems[1] = local_548.data._M_elems[1];
            local_648.data._M_elems[2] = local_548.data._M_elems[2];
            local_648.data._M_elems[3] = local_548.data._M_elems[3];
            local_648.data._M_elems[4] = local_548.data._M_elems[4];
            local_648.data._M_elems[5] = local_548.data._M_elems[5];
            local_648.data._M_elems[6] = local_548.data._M_elems[6];
            local_648.data._M_elems[7] = local_548.data._M_elems[7];
            local_648.data._M_elems[8] = local_548.data._M_elems[8];
            local_648.data._M_elems[9] = local_548.data._M_elems[9];
            local_648.exp = local_548.exp;
            local_648.neg = local_548.neg;
            local_648.fpclass = local_548.fpclass;
            local_648.prec_elem = local_548.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_648,&local_488);
            local_688.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
            local_688.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
            local_688.data._M_elems[8] = local_648.data._M_elems[8];
            local_688.data._M_elems[9] = local_648.data._M_elems[9];
            pcVar15 = &local_588;
LAB_00341b6d:
            local_688.data._M_elems._16_8_ = local_648.data._M_elems._16_8_;
            local_688.exp = local_648.exp;
            local_688.neg = local_648.neg;
            local_688._48_8_ = local_648._48_8_;
            local_688.data._M_elems._0_8_ = local_648.data._M_elems._0_8_;
            local_688.data._M_elems._8_8_ = local_648.data._M_elems._8_8_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_688,pcVar15);
            pnVar10 = (local_610->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar10[lVar16].m_backend.data = local_688.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar10[lVar16].m_backend.data + 8) =
                 local_688.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[lVar16].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[lVar16].m_backend.data + 0x20) =
                 CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
            pnVar10[lVar16].m_backend.exp = local_688.exp;
            pnVar10[lVar16].m_backend.neg = local_688.neg;
            pnVar10[lVar16].m_backend.fpclass = local_688.fpclass;
            pnVar10[lVar16].m_backend.prec_elem = local_688.prec_elem;
            (local_610->rowRight).data[lVar16] = true;
          }
          else {
            local_648.data._M_elems[9]._1_3_ = uStack_113;
            local_648.data._M_elems._32_5_ = local_118;
            local_648.data._M_elems[7]._1_3_ = uStack_11b;
            local_648.data._M_elems._24_5_ = uStack_120;
            local_648.data._M_elems[4] = auStack_130[2];
            local_648.data._M_elems[5] = auStack_130[3];
            local_648.data._M_elems[0] = (uint)local_138;
            local_648.data._M_elems[1] = local_138._4_4_;
            local_648.data._M_elems[2] = auStack_130[0];
            local_648.data._M_elems[3] = auStack_130[1];
            local_648.exp = local_110;
            local_648.neg = (bool)local_10c;
            local_648.fpclass = (fpclass_type)local_108;
            local_648.prec_elem = local_108._4_4_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_648,&local_488);
            auVar6 = (undefined1  [16])local_588.data._M_elems._0_16_;
            local_548.data._M_elems[8] = local_588.data._M_elems[8];
            local_548.data._M_elems[9] = local_588.data._M_elems[9];
            local_548.data._M_elems[7]._1_3_ = local_588.data._M_elems[7]._1_3_;
            local_548.data._M_elems._24_5_ = local_588.data._M_elems._24_5_;
            local_548.data._M_elems[4] = local_588.data._M_elems[4];
            local_548.data._M_elems[5] = local_588.data._M_elems[5];
            local_548.data._M_elems[0] = local_588.data._M_elems[0];
            local_548.data._M_elems[1] = local_588.data._M_elems[1];
            uVar12 = local_548.data._M_elems._0_8_;
            local_548.data._M_elems[2] = local_588.data._M_elems[2];
            local_548.data._M_elems[3] = local_588.data._M_elems[3];
            local_548.exp = local_588.exp;
            local_548.neg = local_588.neg;
            local_548.fpclass = local_588.fpclass;
            local_548.prec_elem = local_588.prec_elem;
            if ((local_588.neg == true) &&
               (local_548.data._M_elems[0] = auVar6._0_4_,
               local_588.fpclass != cpp_dec_float_finite || local_548.data._M_elems[0] != 0)) {
              local_548.neg = false;
            }
            local_688.data._M_elems[8] = local_648.data._M_elems[8];
            local_688.data._M_elems[9] = local_648.data._M_elems[9];
            local_688.data._M_elems[4] = local_648.data._M_elems[4];
            local_688.data._M_elems[5] = local_648.data._M_elems[5];
            local_688.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
            local_688.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
            local_688.data._M_elems[0] = local_648.data._M_elems[0];
            local_688.data._M_elems[1] = local_648.data._M_elems[1];
            local_688.data._M_elems[2] = local_648.data._M_elems[2];
            local_688.data._M_elems[3] = local_648.data._M_elems[3];
            local_688.exp = local_648.exp;
            local_688.neg = local_648.neg;
            local_688.fpclass = local_648.fpclass;
            local_688.prec_elem = local_648.prec_elem;
            local_588.data._M_elems._0_16_ = auVar6;
            local_548.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_688,&local_548);
LAB_00341716:
            pnVar10 = (local_610->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar10[lVar16].m_backend.data = local_688.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar10[lVar16].m_backend.data + 8) =
                 local_688.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&pnVar10[lVar16].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar10[lVar16].m_backend.data + 0x20) =
                 CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
            pnVar10[lVar16].m_backend.exp = local_688.exp;
            pnVar10[lVar16].m_backend.neg = local_688.neg;
            pnVar10[lVar16].m_backend.fpclass = local_688.fpclass;
            pnVar10[lVar16].m_backend.prec_elem = local_688.prec_elem;
          }
        }
        bVar8 = 1 < (long)local_408;
        local_408 = (double)lVar16;
      } while (bVar8);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_448,this_00);
    local_588.fpclass = cpp_dec_float_finite;
    local_588.prec_elem = 10;
    local_588.data._M_elems[0] = 0;
    local_588.data._M_elems[1] = 0;
    local_588.data._M_elems[2] = 0;
    local_588.data._M_elems[3] = 0;
    local_588.data._M_elems[4] = 0;
    local_588.data._M_elems[5] = 0;
    local_588.data._M_elems._24_5_ = 0;
    local_588.data._M_elems[7]._1_3_ = 0;
    local_588.data._M_elems[8] = 0;
    local_588.data._M_elems[9] = 0;
    local_588.exp = 0;
    local_588.neg = false;
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems[0] = 0;
    local_688.data._M_elems[1] = 0;
    local_688.data._M_elems[2] = 0;
    local_688.data._M_elems[3] = 0;
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems[8] = 0;
    local_688.data._M_elems[9] = 0;
    local_688.exp = 0;
    local_688.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_688,0.001);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_588,&local_688,&local_448);
    local_448.fpclass = cpp_dec_float_finite;
    local_448.prec_elem = 10;
    local_448.data._M_elems._0_16_ = ZEXT816(0);
    local_448.data._M_elems[4] = 0;
    local_448.data._M_elems[5] = 0;
    local_448.data._M_elems._24_5_ = 0;
    local_448.data._M_elems[7]._1_3_ = 0;
    local_448.data._M_elems._32_5_ = 0;
    local_448.data._M_elems[9]._1_3_ = 0;
    local_448.exp = 0;
    local_448.neg = false;
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems[0] = 0;
    local_688.data._M_elems[1] = 0;
    local_688.data._M_elems[2] = 0;
    local_688.data._M_elems[3] = 0;
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems[8] = 0;
    local_688.data._M_elems[9] = 0;
    local_688.exp = 0;
    local_688.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_688,1.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_448,&local_688,&local_3a8);
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_688,
               (long)(base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_3e8,&local_588,&local_688);
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_b8,100000.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_f8,0,(type *)0x0);
    local_108._0_4_ = cpp_dec_float_finite;
    local_108._4_4_ = 10;
    local_138._0_4_ = 0;
    local_138._4_4_ = 0;
    auStack_130[0] = 0;
    auStack_130[1] = 0;
    auStack_130[2] = 0;
    auStack_130[3] = 0;
    uStack_120 = 0;
    uStack_11b = 0;
    local_118 = 0;
    uStack_113 = 0;
    local_110 = 0;
    local_10c = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_138,10.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1c0,0,(type *)0x0);
    local_368.fpclass = cpp_dec_float_finite;
    local_368.prec_elem = 10;
    local_368.data._M_elems[0] = 0;
    local_368.data._M_elems[1] = 0;
    local_368.data._M_elems[2] = 0;
    local_368.data._M_elems[3] = 0;
    local_368.data._M_elems[4] = 0;
    local_368.data._M_elems[5] = 0;
    local_368.data._M_elems._24_5_ = 0;
    local_368.data._M_elems[7]._1_3_ = 0;
    local_368.data._M_elems._32_5_ = 0;
    local_368.data._M_elems[9]._1_3_ = 0;
    local_368.exp = 0;
    local_368.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_368,10.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_330,0,(type *)0x0);
    local_1f8.fpclass = cpp_dec_float_finite;
    local_1f8.prec_elem = 10;
    local_1f8.data._M_elems[0] = 0;
    local_1f8.data._M_elems[1] = 0;
    local_1f8.data._M_elems[2] = 0;
    local_1f8.data._M_elems[3] = 0;
    local_1f8.data._M_elems[4] = 0;
    local_1f8.data._M_elems[5] = 0;
    local_1f8.data._M_elems._24_5_ = 0;
    local_1f8.data._M_elems[7]._1_3_ = 0;
    local_1f8.data._M_elems._32_5_ = 0;
    local_1f8.data._M_elems[9]._1_3_ = 0;
    local_1f8.exp = 0;
    local_1f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1f8,-10000.0);
    local_148._0_4_ = cpp_dec_float_finite;
    local_148._4_4_ = 10;
    local_178 = 0;
    uStack_170 = 0;
    local_168 = 0;
    uStack_160 = 0;
    uStack_15b = 0;
    local_158 = 0;
    uStack_153 = 0;
    local_150 = 0;
    local_14c = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_178,-100000.0);
    lVar16 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar16) {
      local_3f8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      uStack_3f0 = 0;
      local_408 = -(double)local_3f8;
      uStack_400 = 0x8000000000000000;
      lVar17 = lVar16 * 0x38;
      uVar13 = lVar16 + 1;
      do {
        local_4c8.fpclass = cpp_dec_float_finite;
        local_4c8.prec_elem = 10;
        local_4c8.data._M_elems[0] = 0;
        local_4c8.data._M_elems[1] = 0;
        local_4c8.data._M_elems[2] = 0;
        local_4c8.data._M_elems[3] = 0;
        local_4c8.data._M_elems[4] = 0;
        local_4c8.data._M_elems[5] = 0;
        local_4c8.data._M_elems._24_5_ = 0;
        local_4c8.data._M_elems[7]._1_3_ = 0;
        local_4c8.data._M_elems._32_5_ = 0;
        local_4c8.data._M_elems[9]._1_3_ = 0;
        local_4c8.exp = 0;
        local_4c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_688,
                   (long)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[uVar13 - 2].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused + -1,(type *)0x0);
        local_4c8.data._M_elems._32_5_ = local_3e8.data._M_elems._32_5_;
        local_4c8.data._M_elems[9]._1_3_ = local_3e8.data._M_elems[9]._1_3_;
        local_4c8.data._M_elems[4] = local_3e8.data._M_elems[4];
        local_4c8.data._M_elems[5] = local_3e8.data._M_elems[5];
        local_4c8.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
        local_4c8.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
        local_4c8.data._M_elems[2] = local_3e8.data._M_elems[2];
        local_4c8.data._M_elems[3] = local_3e8.data._M_elems[3];
        local_4c8.data._M_elems[0] = local_3e8.data._M_elems[0];
        local_4c8.data._M_elems[1] = local_3e8.data._M_elems[1];
        local_4c8.exp = local_3e8.exp;
        local_4c8.neg = local_3e8.neg;
        local_4c8.fpclass = local_3e8.fpclass;
        local_4c8.prec_elem = local_3e8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_4c8,&local_688);
        auVar6 = (undefined1  [16])local_588.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems[0] = 0;
        local_688.data._M_elems[1] = 0;
        local_688.data._M_elems[2] = 0;
        local_688.data._M_elems[3] = 0;
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems[8] = 0;
        local_688.data._M_elems[9] = 0;
        local_688.exp = 0;
        local_688.neg = false;
        pcVar15 = &local_588;
        if (pcVar11 != &local_688) {
          local_688.data._M_elems[8] = local_588.data._M_elems[8];
          local_688.data._M_elems[9] = local_588.data._M_elems[9];
          local_688.data._M_elems[4] = local_588.data._M_elems[4];
          local_688.data._M_elems[5] = local_588.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_588.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_588.data._M_elems[7]._1_3_;
          local_688.data._M_elems[0] = local_588.data._M_elems[0];
          local_688.data._M_elems[1] = local_588.data._M_elems[1];
          local_688.data._M_elems[2] = local_588.data._M_elems[2];
          local_688.data._M_elems[3] = local_588.data._M_elems[3];
          local_688.exp = local_588.exp;
          local_688.neg = local_588.neg;
          local_688.fpclass = local_588.fpclass;
          local_688.prec_elem = local_588.prec_elem;
          pcVar15 = pcVar11;
        }
        local_588.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_688,pcVar15);
        auVar6 = (undefined1  [16])local_448.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_508.fpclass = cpp_dec_float_finite;
        local_508.prec_elem = 10;
        local_508.data._M_elems[0] = 0;
        local_508.data._M_elems[1] = 0;
        local_508.data._M_elems[2] = 0;
        local_508.data._M_elems[3] = 0;
        local_508.data._M_elems[4] = 0;
        local_508.data._M_elems[5] = 0;
        local_508.data._M_elems._24_5_ = 0;
        local_508.data._M_elems[7]._1_3_ = 0;
        local_508.data._M_elems._32_5_ = 0;
        local_508.data._M_elems[9]._1_3_ = 0;
        local_508.exp = 0;
        local_508.neg = false;
        pcVar15 = &local_448;
        if (pcVar11 != &local_508) {
          local_508.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
          local_508.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
          local_508.data._M_elems[4] = local_448.data._M_elems[4];
          local_508.data._M_elems[5] = local_448.data._M_elems[5];
          local_508.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
          local_508.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
          local_508.data._M_elems[0] = local_448.data._M_elems[0];
          local_508.data._M_elems[1] = local_448.data._M_elems[1];
          local_508.data._M_elems[2] = local_448.data._M_elems[2];
          local_508.data._M_elems[3] = local_448.data._M_elems[3];
          local_508.exp = local_448.exp;
          local_508.neg = local_448.neg;
          local_508.fpclass = local_448.fpclass;
          local_508.prec_elem = local_448.prec_elem;
          pcVar15 = pcVar11;
        }
        local_448.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_508,pcVar15);
        auVar6 = (undefined1  [16])local_448.data._M_elems._0_16_;
        pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
        local_488.fpclass = cpp_dec_float_finite;
        local_488.prec_elem = 10;
        local_488.data._M_elems[0] = 0;
        local_488.data._M_elems[1] = 0;
        local_488.data._M_elems[2] = 0;
        local_488.data._M_elems[3] = 0;
        local_488.data._M_elems[4] = 0;
        local_488.data._M_elems[5] = 0;
        local_488.data._M_elems._24_5_ = 0;
        local_488.data._M_elems[7]._1_3_ = 0;
        local_488.data._M_elems._32_5_ = 0;
        local_488.data._M_elems[9]._1_3_ = 0;
        local_488.exp = 0;
        local_488.neg = false;
        pcVar15 = &local_448;
        if (pcVar11 != &local_488) {
          local_488.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
          local_488.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
          local_488.data._M_elems[4] = local_448.data._M_elems[4];
          local_488.data._M_elems[5] = local_448.data._M_elems[5];
          local_488.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
          local_488.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
          local_488.data._M_elems[0] = local_448.data._M_elems[0];
          local_488.data._M_elems[1] = local_448.data._M_elems[1];
          local_488.data._M_elems[2] = local_448.data._M_elems[2];
          local_488.data._M_elems[3] = local_448.data._M_elems[3];
          local_488.exp = local_448.exp;
          local_488.neg = local_448.neg;
          local_488.fpclass = local_448.fpclass;
          local_488.prec_elem = local_448.prec_elem;
          pcVar15 = pcVar11;
        }
        local_448.data._M_elems._0_16_ = auVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_488,pcVar15);
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_5c8.fpclass = cpp_dec_float_finite;
        local_5c8.prec_elem = 10;
        local_5c8.data._M_elems._0_16_ = ZEXT816(0);
        local_5c8.data._M_elems[4] = 0;
        local_5c8.data._M_elems[5] = 0;
        local_5c8.data._M_elems._24_5_ = 0;
        local_5c8.data._M_elems[7]._1_3_ = 0;
        local_5c8.data._M_elems._32_5_ = 0;
        local_5c8.data._M_elems[9]._1_3_ = 0;
        local_5c8.exp = 0;
        local_5c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_5c8,(double)local_3f8);
        if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
            (local_5c8.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&pnVar10[-1].m_backend.data + lVar17),&local_5c8), -1 < iVar9)
           ) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_5c8.fpclass = cpp_dec_float_finite;
          local_5c8.prec_elem = 10;
          local_5c8.data._M_elems._0_16_ = ZEXT816(0);
          local_5c8.data._M_elems[4] = 0;
          local_5c8.data._M_elems[5] = 0;
          local_5c8.data._M_elems._24_5_ = 0;
          local_5c8.data._M_elems[7]._1_3_ = 0;
          local_5c8.data._M_elems._32_5_ = 0;
          local_5c8.data._M_elems[9]._1_3_ = 0;
          local_5c8.exp = 0;
          local_5c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_5c8,local_408);
          if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
              (local_5c8.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar10[-1].m_backend.data + lVar17),&local_5c8), iVar9 < 1
             )) {
            local_608.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
            local_608.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
            local_608.data._M_elems[4] = local_1f8.data._M_elems[4];
            local_608.data._M_elems[5] = local_1f8.data._M_elems[5];
            local_608.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
            local_608.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
            local_608.data._M_elems[0] = local_1f8.data._M_elems[0];
            local_608.data._M_elems[1] = local_1f8.data._M_elems[1];
            local_608.data._M_elems[2] = local_1f8.data._M_elems[2];
            local_608.data._M_elems[3] = local_1f8.data._M_elems[3];
            local_608.exp = local_1f8.exp;
            local_608.neg = local_1f8.neg;
            local_608.fpclass = local_1f8.fpclass;
            local_608.prec_elem = local_1f8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_608,&local_4c8);
            local_648.data._M_elems[9] = local_688.data._M_elems[9];
            local_648.data._M_elems[8] = local_688.data._M_elems[8];
            local_648.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
            local_648.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
            local_648.data._M_elems[4] = local_688.data._M_elems[4];
            local_648.data._M_elems[5] = local_688.data._M_elems[5];
            local_648.data._M_elems[0] = local_688.data._M_elems[0];
            local_648.data._M_elems[1] = local_688.data._M_elems[1];
            uVar12 = local_648.data._M_elems._0_8_;
            local_648.data._M_elems[2] = local_688.data._M_elems[2];
            local_648.data._M_elems[3] = local_688.data._M_elems[3];
            local_648.exp = local_688.exp;
            local_648.neg = local_688.neg;
            local_648.fpclass = local_688.fpclass;
            local_648.prec_elem = local_688.prec_elem;
            if ((local_688.neg == true) &&
               (local_648.data._M_elems[0] = local_688.data._M_elems[0],
               local_688.fpclass != cpp_dec_float_finite || local_648.data._M_elems[0] != 0)) {
              local_648.neg = false;
            }
            local_5c8.data._M_elems._32_5_ = local_608.data._M_elems._32_5_;
            local_5c8.data._M_elems[9]._1_3_ = local_608.data._M_elems[9]._1_3_;
            local_5c8.data._M_elems[4] = local_608.data._M_elems[4];
            local_5c8.data._M_elems[5] = local_608.data._M_elems[5];
            local_5c8.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
            local_5c8.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
            local_5c8.data._M_elems[2] = local_608.data._M_elems[2];
            local_5c8.data._M_elems[3] = local_608.data._M_elems[3];
            local_5c8.data._M_elems[0] = local_608.data._M_elems[0];
            local_5c8.data._M_elems[1] = local_608.data._M_elems[1];
            local_5c8.exp = local_608.exp;
            local_5c8.neg = local_608.neg;
            local_5c8.fpclass = local_608.fpclass;
            local_5c8.prec_elem = local_608.prec_elem;
            local_648.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_5c8,&local_648);
            goto LAB_0033eebb;
          }
          local_648.data._M_elems[9]._1_3_ = local_368.data._M_elems[9]._1_3_;
          local_648.data._M_elems._32_5_ = local_368.data._M_elems._32_5_;
          local_648.data._M_elems[7]._1_3_ = local_368.data._M_elems[7]._1_3_;
          local_648.data._M_elems._24_5_ = local_368.data._M_elems._24_5_;
          local_648.data._M_elems[4] = local_368.data._M_elems[4];
          local_648.data._M_elems[5] = local_368.data._M_elems[5];
          local_648.data._M_elems[0] = local_368.data._M_elems[0];
          local_648.data._M_elems[1] = local_368.data._M_elems[1];
          local_648.data._M_elems[2] = local_368.data._M_elems[2];
          local_648.data._M_elems[3] = local_368.data._M_elems[3];
          local_648.exp = local_368.exp;
          local_648.neg = local_368.neg;
          local_648.fpclass = local_368.fpclass;
          local_648.prec_elem = local_368.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_648,&local_488);
          local_608.data._M_elems[0] = local_648.data._M_elems[0];
          local_608.data._M_elems[1] = local_648.data._M_elems[1];
          local_608.data._M_elems[2] = local_648.data._M_elems[2];
          local_608.data._M_elems[3] = local_648.data._M_elems[3];
          local_608.data._M_elems[4] = local_648.data._M_elems[4];
          local_608.data._M_elems[5] = local_648.data._M_elems[5];
          local_608.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
          local_608.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
          local_608.data._M_elems._32_5_ = local_648.data._M_elems._32_5_;
          local_608.data._M_elems[9]._1_3_ = local_648.data._M_elems[9]._1_3_;
          local_608.exp = local_648.exp;
          local_608.neg = local_648.neg;
          local_608.fpclass = local_648.fpclass;
          local_608.prec_elem = local_648.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_608,&local_4c8);
          local_5c8.data._M_elems[2] = local_608.data._M_elems[2];
          local_5c8.data._M_elems[3] = local_608.data._M_elems[3];
          local_5c8.data._M_elems[0] = local_608.data._M_elems[0];
          local_5c8.data._M_elems[1] = local_608.data._M_elems[1];
          local_5c8.data._M_elems[4] = local_608.data._M_elems[4];
          local_5c8.data._M_elems[5] = local_608.data._M_elems[5];
          local_5c8.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
          local_5c8.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
          local_5c8.data._M_elems._32_5_ = local_608.data._M_elems._32_5_;
          local_5c8.data._M_elems[9]._1_3_ = local_608.data._M_elems[9]._1_3_;
          local_5c8.exp = local_608.exp;
          local_5c8.neg = local_608.neg;
          local_5c8.fpclass = local_608.fpclass;
          local_5c8.prec_elem = local_608.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_5c8,&local_688);
          pnVar10 = (local_610->colWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
          *(undefined8 *)puVar2 = local_5c8.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_5c8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
          *(undefined8 *)puVar2 = local_5c8.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_);
          *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
               CONCAT35(local_5c8.data._M_elems[9]._1_3_,local_5c8.data._M_elems._32_5_);
          *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_5c8.exp;
          *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_5c8.neg;
          *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_5c8._48_8_;
          (local_610->colUp).data[uVar13 - 2] = false;
        }
        else {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar17);
          pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .up.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 10;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems._24_5_ = 0;
          local_238.data._M_elems[7]._1_3_ = 0;
          local_238.data._M_elems._32_5_ = 0;
          local_238.data._M_elems[9]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          if (pcVar15 == &local_238) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_238,pcVar11);
            if (local_238.data._M_elems[0] != 0 || local_238.fpclass != cpp_dec_float_finite) {
              local_238.neg = (bool)(local_238.neg ^ 1);
            }
          }
          else {
            if (pcVar11 != &local_238) {
              uVar12 = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18);
              local_238.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_238.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_238.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
              local_238.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x30);
              local_238.data._M_elems._16_8_ =
                   *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              uVar12 = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x20);
              local_238.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_238.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_238.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10);
              local_238.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc);
              local_238._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_238,pcVar15);
          }
          local_5c8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
          local_5c8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
          local_5c8.data._M_elems[4] = local_238.data._M_elems[4];
          local_5c8.data._M_elems[5] = local_238.data._M_elems[5];
          local_5c8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
          local_5c8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
          local_5c8.data._M_elems[0] = local_238.data._M_elems[0];
          local_5c8.data._M_elems[1] = local_238.data._M_elems[1];
          uVar12 = local_5c8.data._M_elems._0_8_;
          local_5c8.data._M_elems[2] = local_238.data._M_elems[2];
          local_5c8.data._M_elems[3] = local_238.data._M_elems[3];
          local_5c8.exp = local_238.exp;
          local_5c8.neg = local_238.neg;
          local_5c8.fpclass = local_238.fpclass;
          local_5c8.prec_elem = local_238.prec_elem;
          if ((local_238.neg == true) &&
             (local_5c8.data._M_elems[0] = local_238.data._M_elems[0],
             local_5c8.data._M_elems[0] != 0 || local_238.fpclass != cpp_dec_float_finite)) {
            local_5c8.neg = false;
          }
          local_5c8.data._M_elems._0_8_ = uVar12;
          if (((local_238.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_38 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_5c8,(cpp_dec_float<50U,_int,_void> *)local_68), -1 < iVar9))
          {
            pnVar10 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_5c8.fpclass = cpp_dec_float_finite;
            local_5c8.prec_elem = 10;
            local_5c8.data._M_elems[0] = 0;
            local_5c8.data._M_elems[1] = 0;
            local_5c8.data._M_elems[2] = 0;
            local_5c8.data._M_elems[3] = 0;
            local_5c8.data._M_elems[4] = 0;
            local_5c8.data._M_elems[5] = 0;
            local_5c8.data._M_elems._24_5_ = 0;
            local_5c8.data._M_elems[7]._1_3_ = 0;
            local_5c8.data._M_elems._32_5_ = 0;
            local_5c8.data._M_elems[9]._1_3_ = 0;
            local_5c8.exp = 0;
            local_5c8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_5c8,local_408);
            if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
                (local_5c8.fpclass == cpp_dec_float_NaN)) ||
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)&pnVar10[-1].m_backend.data + lVar17),&local_5c8),
               iVar9 < 1)) {
              local_648.data._M_elems[9]._1_3_ = local_368.data._M_elems[9]._1_3_;
              local_648.data._M_elems._32_5_ = local_368.data._M_elems._32_5_;
              local_648.data._M_elems[7]._1_3_ = local_368.data._M_elems[7]._1_3_;
              local_648.data._M_elems._24_5_ = local_368.data._M_elems._24_5_;
              local_648.data._M_elems[4] = local_368.data._M_elems[4];
              local_648.data._M_elems[5] = local_368.data._M_elems[5];
              local_648.data._M_elems[0] = local_368.data._M_elems[0];
              local_648.data._M_elems[1] = local_368.data._M_elems[1];
              local_648.data._M_elems[2] = local_368.data._M_elems[2];
              local_648.data._M_elems[3] = local_368.data._M_elems[3];
              local_648.exp = local_368.exp;
              local_648.neg = local_368.neg;
              local_648.fpclass = local_368.fpclass;
              local_648.prec_elem = local_368.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_648,&local_508);
              local_608.data._M_elems[0] = local_648.data._M_elems[0];
              local_608.data._M_elems[1] = local_648.data._M_elems[1];
              local_608.data._M_elems[2] = local_648.data._M_elems[2];
              local_608.data._M_elems[3] = local_648.data._M_elems[3];
              local_608.data._M_elems[4] = local_648.data._M_elems[4];
              local_608.data._M_elems[5] = local_648.data._M_elems[5];
              local_608.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
              local_608.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
              local_608.data._M_elems._32_5_ = local_648.data._M_elems._32_5_;
              local_608.data._M_elems[9]._1_3_ = local_648.data._M_elems[9]._1_3_;
              local_608.exp = local_648.exp;
              local_608.neg = local_648.neg;
              local_608.fpclass = local_648.fpclass;
              local_608.prec_elem = local_648.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_608,&local_688);
              local_5c8.data._M_elems[2] = local_608.data._M_elems[2];
              local_5c8.data._M_elems[3] = local_608.data._M_elems[3];
              local_5c8.data._M_elems[0] = local_608.data._M_elems[0];
              local_5c8.data._M_elems[1] = local_608.data._M_elems[1];
              local_5c8.data._M_elems[4] = local_608.data._M_elems[4];
              local_5c8.data._M_elems[5] = local_608.data._M_elems[5];
              local_5c8.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
              local_5c8.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
              local_5c8.data._M_elems._32_5_ = local_608.data._M_elems._32_5_;
              local_5c8.data._M_elems[9]._1_3_ = local_608.data._M_elems[9]._1_3_;
              local_5c8.exp = local_608.exp;
              local_5c8.neg = local_608.neg;
              local_5c8.fpclass = local_608.fpclass;
              local_5c8.prec_elem = local_608.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_5c8,&local_4c8);
              pnVar10 = (local_610->colWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_5c8.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_5c8.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              *(undefined8 *)puVar2 = local_5c8.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_);
              *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                   CONCAT35(local_5c8.data._M_elems[9]._1_3_,local_5c8.data._M_elems._32_5_);
              *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_5c8.exp;
              *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_5c8.neg;
              *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_5c8._48_8_;
              (local_610->colUp).data[uVar13 - 2] = true;
            }
            else {
              local_648.data._M_elems[9]._1_3_ = uStack_113;
              local_648.data._M_elems._32_5_ = local_118;
              local_648.data._M_elems[7]._1_3_ = uStack_11b;
              local_648.data._M_elems._24_5_ = uStack_120;
              local_648.data._M_elems[4] = auStack_130[2];
              local_648.data._M_elems[5] = auStack_130[3];
              local_648.data._M_elems[0] = (uint)local_138;
              local_648.data._M_elems[1] = local_138._4_4_;
              local_648.data._M_elems[2] = auStack_130[0];
              local_648.data._M_elems[3] = auStack_130[1];
              local_648.exp = local_110;
              local_648.neg = (bool)local_10c;
              local_648.fpclass = (fpclass_type)local_108;
              local_648.prec_elem = local_108._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_648,&local_488);
              local_608.data._M_elems[0] = local_648.data._M_elems[0];
              local_608.data._M_elems[1] = local_648.data._M_elems[1];
              local_608.data._M_elems[2] = local_648.data._M_elems[2];
              local_608.data._M_elems[3] = local_648.data._M_elems[3];
              local_608.data._M_elems[4] = local_648.data._M_elems[4];
              local_608.data._M_elems[5] = local_648.data._M_elems[5];
              local_608.data._M_elems._24_5_ = local_648.data._M_elems._24_5_;
              local_608.data._M_elems[7]._1_3_ = local_648.data._M_elems[7]._1_3_;
              local_608.data._M_elems._32_5_ = local_648.data._M_elems._32_5_;
              local_608.data._M_elems[9]._1_3_ = local_648.data._M_elems[9]._1_3_;
              local_608.exp = local_648.exp;
              local_608.neg = local_648.neg;
              local_608.fpclass = local_648.fpclass;
              local_608.prec_elem = local_648.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_608,&local_508);
              local_5c8.data._M_elems[2] = local_608.data._M_elems[2];
              local_5c8.data._M_elems[3] = local_608.data._M_elems[3];
              local_5c8.data._M_elems[0] = local_608.data._M_elems[0];
              local_5c8.data._M_elems[1] = local_608.data._M_elems[1];
              local_5c8.data._M_elems[4] = local_608.data._M_elems[4];
              local_5c8.data._M_elems[5] = local_608.data._M_elems[5];
              local_5c8.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
              local_5c8.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
              local_5c8.data._M_elems._32_5_ = local_608.data._M_elems._32_5_;
              local_5c8.data._M_elems[9]._1_3_ = local_608.data._M_elems[9]._1_3_;
              local_5c8.exp = local_608.exp;
              local_5c8.neg = local_608.neg;
              local_5c8.fpclass = local_608.fpclass;
              local_5c8.prec_elem = local_608.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_5c8,&local_4c8);
              pnVar10 = (local_610->colWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_5c8.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_5c8.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              *(undefined8 *)puVar2 = local_5c8.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_);
              *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                   CONCAT35(local_5c8.data._M_elems[9]._1_3_,local_5c8.data._M_elems._32_5_);
              *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_5c8.exp;
              *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_5c8.neg;
              *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_5c8._48_8_;
              if (local_488.neg == true) {
                local_488.neg =
                     local_488.data._M_elems[0] == 0 && local_488.fpclass == cpp_dec_float_finite;
              }
              if (local_508.neg == true) {
                local_508.neg =
                     local_508.data._M_elems[0] == 0 && local_508.fpclass == cpp_dec_float_finite;
              }
              if ((local_488.fpclass == cpp_dec_float_NaN || local_508.fpclass == cpp_dec_float_NaN)
                 || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_508,&local_488), -1 < iVar9)) {
                (local_610->colUp).data[uVar13 - 2] = false;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)&(local_610->colWeight).data.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                           lVar17),&local_688);
              }
              else {
                (local_610->colUp).data[uVar13 - 2] = true;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)&(local_610->colWeight).data.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                           lVar17),&local_688);
              }
            }
          }
          else {
            local_608.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
            local_608.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
            local_608.data._M_elems[4] = local_b8.data._M_elems[4];
            local_608.data._M_elems[5] = local_b8.data._M_elems[5];
            local_608.data._M_elems._24_5_ = local_b8.data._M_elems._24_5_;
            local_608.data._M_elems[7]._1_3_ = local_b8.data._M_elems[7]._1_3_;
            local_608.data._M_elems[0] = local_b8.data._M_elems[0];
            local_608.data._M_elems[1] = local_b8.data._M_elems[1];
            local_608.data._M_elems[2] = local_b8.data._M_elems[2];
            local_608.data._M_elems[3] = local_b8.data._M_elems[3];
            local_608.exp = local_b8.exp;
            local_608.neg = local_b8.neg;
            local_608.fpclass = local_b8.fpclass;
            local_608.prec_elem = local_b8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_608,&local_4c8);
            local_648.data._M_elems[9] = local_688.data._M_elems[9];
            local_648.data._M_elems[8] = local_688.data._M_elems[8];
            local_648.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
            local_648.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
            local_648.data._M_elems[4] = local_688.data._M_elems[4];
            local_648.data._M_elems[5] = local_688.data._M_elems[5];
            local_648.data._M_elems[0] = local_688.data._M_elems[0];
            local_648.data._M_elems[1] = local_688.data._M_elems[1];
            uVar12 = local_648.data._M_elems._0_8_;
            local_648.data._M_elems[2] = local_688.data._M_elems[2];
            local_648.data._M_elems[3] = local_688.data._M_elems[3];
            local_648.exp = local_688.exp;
            local_648.neg = local_688.neg;
            local_648.fpclass = local_688.fpclass;
            local_648.prec_elem = local_688.prec_elem;
            if ((local_688.neg == true) &&
               (local_648.data._M_elems[0] = local_688.data._M_elems[0],
               local_688.fpclass != cpp_dec_float_finite || local_648.data._M_elems[0] != 0)) {
              local_648.neg = false;
            }
            local_5c8.data._M_elems._32_5_ = local_608.data._M_elems._32_5_;
            local_5c8.data._M_elems[9]._1_3_ = local_608.data._M_elems[9]._1_3_;
            local_5c8.data._M_elems[4] = local_608.data._M_elems[4];
            local_5c8.data._M_elems[5] = local_608.data._M_elems[5];
            local_5c8.data._M_elems._24_5_ = local_608.data._M_elems._24_5_;
            local_5c8.data._M_elems[7]._1_3_ = local_608.data._M_elems[7]._1_3_;
            local_5c8.data._M_elems[2] = local_608.data._M_elems[2];
            local_5c8.data._M_elems[3] = local_608.data._M_elems[3];
            local_5c8.data._M_elems[0] = local_608.data._M_elems[0];
            local_5c8.data._M_elems[1] = local_608.data._M_elems[1];
            local_5c8.exp = local_608.exp;
            local_5c8.neg = local_608.neg;
            local_5c8.fpclass = local_608.fpclass;
            local_5c8.prec_elem = local_608.prec_elem;
            local_648.data._M_elems._0_8_ = uVar12;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_5c8,&local_648);
LAB_0033eebb:
            pnVar10 = (local_610->colWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_5c8.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_5c8.data._M_elems._8_8_;
            puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
            *(undefined8 *)puVar2 = local_5c8.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_);
            *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                 CONCAT35(local_5c8.data._M_elems[9]._1_3_,local_5c8.data._M_elems._32_5_);
            *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_5c8.exp;
            *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_5c8.neg;
            *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_5c8._48_8_;
          }
        }
        uVar13 = uVar13 - 1;
        lVar17 = lVar17 + -0x38;
      } while (1 < uVar13);
    }
    lVar16 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar16) {
      local_3f8 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    **)(in_FS_OFFSET + -8);
      uStack_3f0 = 0;
      local_408 = -(double)local_3f8;
      uStack_400 = 0x8000000000000000;
      lVar17 = lVar16 * 0x38;
      uVar13 = lVar16 + 1;
      do {
        pnVar10 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems[0] = 0;
        local_688.data._M_elems[1] = 0;
        local_688.data._M_elems[2] = 0;
        local_688.data._M_elems[3] = 0;
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems[8] = 0;
        local_688.data._M_elems[9] = 0;
        local_688.exp = 0;
        local_688.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_3f8);
        if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
            (local_688.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)
                               ((long)&pnVar10[-1].m_backend.data + lVar17),&local_688), -1 < iVar9)
           ) {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_688.fpclass = cpp_dec_float_finite;
          local_688.prec_elem = 10;
          local_688.data._M_elems[0] = 0;
          local_688.data._M_elems[1] = 0;
          local_688.data._M_elems[2] = 0;
          local_688.data._M_elems[3] = 0;
          local_688.data._M_elems[4] = 0;
          local_688.data._M_elems[5] = 0;
          local_688.data._M_elems._24_5_ = 0;
          local_688.data._M_elems[7]._1_3_ = 0;
          local_688.data._M_elems[8] = 0;
          local_688.data._M_elems[9] = 0;
          local_688.exp = 0;
          local_688.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_688,local_408);
          if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
              (local_688.fpclass == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar10[-1].m_backend.data + lVar17),&local_688), iVar9 < 1
             )) {
            pnVar10 = (local_610->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                 CONCAT35(uStack_153,local_158);
            puVar3 = (undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
            *puVar3 = local_168;
            puVar3[1] = CONCAT35(uStack_15b,uStack_160);
            puVar3 = (undefined8 *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *puVar3 = local_178;
            puVar3[1] = uStack_170;
            *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_150;
            *(byte *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_14c;
            uVar12 = local_148;
            goto LAB_0033f91d;
          }
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_4c8.fpclass = cpp_dec_float_finite;
          local_4c8.prec_elem = 10;
          local_4c8.data._M_elems._0_16_ = ZEXT816(0);
          local_4c8.data._M_elems[4] = 0;
          local_4c8.data._M_elems[5] = 0;
          local_4c8.data._M_elems._24_5_ = 0;
          local_4c8.data._M_elems[7]._1_3_ = 0;
          local_4c8.data._M_elems._32_5_ = 0;
          local_4c8.data._M_elems[9]._1_3_ = 0;
          local_4c8.exp = 0;
          local_4c8.neg = false;
          pcVar15 = &local_448;
          if (pcVar11 != &local_4c8) {
            local_4c8.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
            local_4c8.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
            local_4c8.data._M_elems[4] = local_448.data._M_elems[4];
            local_4c8.data._M_elems[5] = local_448.data._M_elems[5];
            local_4c8.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
            local_4c8.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
            local_4c8.data._M_elems[0] = local_448.data._M_elems[0];
            local_4c8.data._M_elems[1] = local_448.data._M_elems[1];
            local_4c8.data._M_elems[2] = local_448.data._M_elems[2];
            local_4c8.data._M_elems[3] = local_448.data._M_elems[3];
            local_4c8.exp = local_448.exp;
            local_4c8.neg = local_448.neg;
            local_4c8.fpclass = local_448.fpclass;
            local_4c8.prec_elem = local_448.prec_elem;
            pcVar15 = pcVar11;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_4c8,pcVar15);
          local_688.data._M_elems[0] = local_330.data._M_elems[0];
          local_688.data._M_elems[1] = local_330.data._M_elems[1];
          local_688.data._M_elems[2] = local_330.data._M_elems[2];
          local_688.data._M_elems[3] = local_330.data._M_elems[3];
          local_688.data._M_elems[4] = local_330.data._M_elems[4];
          local_688.data._M_elems[5] = local_330.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_330.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_330.data._M_elems[7]._1_3_;
          local_688.data._M_elems[8] = local_330.data._M_elems[8];
          local_688.data._M_elems[9] = local_330.data._M_elems[9];
          local_688.exp = local_330.exp;
          local_688.neg = local_330.neg;
          local_688.fpclass = local_330.fpclass;
          local_688.prec_elem = local_330.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_688,&local_4c8);
          pnVar10 = (local_610->rowWeight).data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
          *(undefined8 *)puVar2 = local_688.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_688.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
          *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
          *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
               CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
          *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_688.exp;
          *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_688.neg;
          *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_688._48_8_;
          (local_610->rowRight).data[uVar13 - 2] = false;
        }
        else {
          pnVar10 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar11 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar10[-1].m_backend.data + lVar17);
          pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17);
          local_278.fpclass = cpp_dec_float_finite;
          local_278.prec_elem = 10;
          local_278.data._M_elems[0] = 0;
          local_278.data._M_elems[1] = 0;
          local_278.data._M_elems[2] = 0;
          local_278.data._M_elems[3] = 0;
          local_278.data._M_elems[4] = 0;
          local_278.data._M_elems[5] = 0;
          local_278.data._M_elems._24_5_ = 0;
          local_278.data._M_elems[7]._1_3_ = 0;
          local_278.data._M_elems._32_5_ = 0;
          local_278.data._M_elems[9]._1_3_ = 0;
          local_278.exp = 0;
          local_278.neg = false;
          if (pcVar15 == &local_278) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_278,pcVar11);
            if (local_278.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite) {
              local_278.neg = (bool)(local_278.neg ^ 1);
            }
          }
          else {
            if (pcVar11 != &local_278) {
              uVar12 = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18);
              local_278.data._M_elems._32_5_ = SUB85(uVar12,0);
              local_278.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_278.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
              local_278.data._M_elems._8_8_ =
                   *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x30);
              local_278.data._M_elems._16_8_ =
                   *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              uVar12 = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -0x20);
              local_278.data._M_elems._24_5_ = SUB85(uVar12,0);
              local_278.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar12 >> 0x28);
              local_278.exp = *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10);
              local_278.neg = *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc);
              local_278._48_8_ = *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_278,pcVar15);
          }
          local_688.data._M_elems[8] = local_278.data._M_elems[8];
          local_688.data._M_elems[9] =
               (uint)(CONCAT35(local_278.data._M_elems[9]._1_3_,local_278.data._M_elems._32_5_) >>
                     0x20);
          local_688.data._M_elems[4] = local_278.data._M_elems[4];
          local_688.data._M_elems[5] = local_278.data._M_elems[5];
          local_688.data._M_elems._24_5_ = local_278.data._M_elems._24_5_;
          local_688.data._M_elems[7]._1_3_ = local_278.data._M_elems[7]._1_3_;
          local_688.data._M_elems[0] = local_278.data._M_elems[0];
          local_688.data._M_elems[1] = local_278.data._M_elems[1];
          uVar12 = local_688.data._M_elems._0_8_;
          local_688.data._M_elems[2] = local_278.data._M_elems[2];
          local_688.data._M_elems[3] = local_278.data._M_elems[3];
          local_688.exp = local_278.exp;
          local_688.neg = local_278.neg;
          local_688.fpclass = local_278.fpclass;
          local_688.prec_elem = local_278.prec_elem;
          if ((local_278.neg == true) &&
             (local_688.data._M_elems[0] = local_278.data._M_elems[0],
             local_688.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite)) {
            local_688.neg = false;
          }
          local_688.data._M_elems._0_8_ = uVar12;
          if (((local_278.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_38 == cpp_dec_float_NaN)) ||
             (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_688,(cpp_dec_float<50U,_int,_void> *)local_68), -1 < iVar9))
          {
            pnVar10 = (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_688.fpclass = cpp_dec_float_finite;
            local_688.prec_elem = 10;
            local_688.data._M_elems[0] = 0;
            local_688.data._M_elems[1] = 0;
            local_688.data._M_elems[2] = 0;
            local_688.data._M_elems[3] = 0;
            local_688.data._M_elems[4] = 0;
            local_688.data._M_elems[5] = 0;
            local_688.data._M_elems._24_5_ = 0;
            local_688.data._M_elems[7]._1_3_ = 0;
            local_688.data._M_elems[8] = 0;
            local_688.data._M_elems[9] = 0;
            local_688.exp = 0;
            local_688.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_688,local_408);
            if (((*(int *)((long)&(pnVar10->m_backend).data + lVar17 + -8) == 2) ||
                (local_688.fpclass == cpp_dec_float_NaN)) ||
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)
                                   ((long)&pnVar10[-1].m_backend.data + lVar17),&local_688),
               auVar6 = (undefined1  [16])local_448.data._M_elems._0_16_, iVar9 < 1)) {
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar17);
              local_4c8.fpclass = cpp_dec_float_finite;
              local_4c8.prec_elem = 10;
              local_4c8.data._M_elems._0_16_ = ZEXT816(0);
              local_4c8.data._M_elems[4] = 0;
              local_4c8.data._M_elems[5] = 0;
              local_4c8.data._M_elems._24_5_ = 0;
              local_4c8.data._M_elems[7]._1_3_ = 0;
              local_4c8.data._M_elems._32_5_ = 0;
              local_4c8.data._M_elems[9]._1_3_ = 0;
              local_4c8.exp = 0;
              local_4c8.neg = false;
              pcVar15 = &local_448;
              if (pcVar11 != &local_4c8) {
                local_4c8.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
                local_4c8.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
                local_4c8.data._M_elems[4] = local_448.data._M_elems[4];
                local_4c8.data._M_elems[5] = local_448.data._M_elems[5];
                local_4c8.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
                local_4c8.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
                local_4c8.data._M_elems[0] = local_448.data._M_elems[0];
                local_4c8.data._M_elems[1] = local_448.data._M_elems[1];
                local_4c8.data._M_elems[2] = local_448.data._M_elems[2];
                local_4c8.data._M_elems[3] = local_448.data._M_elems[3];
                local_4c8.exp = local_448.exp;
                local_4c8.neg = local_448.neg;
                local_4c8.fpclass = local_448.fpclass;
                local_4c8.prec_elem = local_448.prec_elem;
                pcVar15 = pcVar11;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_4c8,pcVar15);
              local_688.data._M_elems[0] = local_330.data._M_elems[0];
              local_688.data._M_elems[1] = local_330.data._M_elems[1];
              local_688.data._M_elems[2] = local_330.data._M_elems[2];
              local_688.data._M_elems[3] = local_330.data._M_elems[3];
              local_688.data._M_elems[4] = local_330.data._M_elems[4];
              local_688.data._M_elems[5] = local_330.data._M_elems[5];
              local_688.data._M_elems._24_5_ = local_330.data._M_elems._24_5_;
              local_688.data._M_elems[7]._1_3_ = local_330.data._M_elems[7]._1_3_;
              local_688.data._M_elems[8] = local_330.data._M_elems[8];
              local_688.data._M_elems[9] = local_330.data._M_elems[9];
              local_688.exp = local_330.exp;
              local_688.neg = local_330.neg;
              local_688.fpclass = local_330.fpclass;
              local_688.prec_elem = local_330.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_688,&local_4c8);
              pnVar10 = (local_610->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_688.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_688.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
              *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                   CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]);
              *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_688.exp;
              *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_688.neg;
              *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_688._48_8_;
              (local_610->rowRight).data[uVar13 - 2] = true;
            }
            else {
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .right.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar17);
              local_688.fpclass = cpp_dec_float_finite;
              local_688.prec_elem = 10;
              local_688.data._M_elems[0] = 0;
              local_688.data._M_elems[1] = 0;
              local_688.data._M_elems[2] = 0;
              local_688.data._M_elems[3] = 0;
              local_688.data._M_elems[4] = 0;
              local_688.data._M_elems[5] = 0;
              local_688.data._M_elems._24_5_ = 0;
              local_688.data._M_elems[7]._1_3_ = 0;
              local_688.data._M_elems[8] = 0;
              local_688.data._M_elems[9] = 0;
              local_688.exp = 0;
              local_688.neg = false;
              pcVar15 = &local_448;
              if (pcVar11 != &local_688) {
                local_688.data._M_elems[8] = local_448.data._M_elems[8];
                local_688.data._M_elems[9] =
                     (uint)(CONCAT35(local_448.data._M_elems[9]._1_3_,local_448.data._M_elems._32_5_
                                    ) >> 0x20);
                local_688.data._M_elems[4] = local_448.data._M_elems[4];
                local_688.data._M_elems[5] = local_448.data._M_elems[5];
                local_688.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
                local_688.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
                local_688.data._M_elems[0] = local_448.data._M_elems[0];
                local_688.data._M_elems[1] = local_448.data._M_elems[1];
                local_688.data._M_elems[2] = local_448.data._M_elems[2];
                local_688.data._M_elems[3] = local_448.data._M_elems[3];
                local_688.exp = local_448.exp;
                local_688.neg = local_448.neg;
                local_688.fpclass = local_448.fpclass;
                local_688.prec_elem = local_448.prec_elem;
                pcVar15 = pcVar11;
              }
              local_448.data._M_elems._0_16_ = auVar6;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_688,pcVar15);
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                        lVar17);
              local_4c8.fpclass = cpp_dec_float_finite;
              local_4c8.prec_elem = 10;
              local_4c8.data._M_elems._0_16_ = ZEXT816(0);
              local_4c8.data._M_elems[4] = 0;
              local_4c8.data._M_elems[5] = 0;
              local_4c8.data._M_elems._24_5_ = 0;
              local_4c8.data._M_elems[7]._1_3_ = 0;
              local_4c8.data._M_elems._32_5_ = 0;
              local_4c8.data._M_elems[9]._1_3_ = 0;
              local_4c8.exp = 0;
              local_4c8.neg = false;
              pcVar15 = &local_448;
              if (pcVar11 != &local_4c8) {
                local_4c8.data._M_elems._32_5_ = local_448.data._M_elems._32_5_;
                local_4c8.data._M_elems[9]._1_3_ = local_448.data._M_elems[9]._1_3_;
                local_4c8.data._M_elems[4] = local_448.data._M_elems[4];
                local_4c8.data._M_elems[5] = local_448.data._M_elems[5];
                local_4c8.data._M_elems._24_5_ = local_448.data._M_elems._24_5_;
                local_4c8.data._M_elems[7]._1_3_ = local_448.data._M_elems[7]._1_3_;
                local_4c8.data._M_elems[0] = local_448.data._M_elems[0];
                local_4c8.data._M_elems[1] = local_448.data._M_elems[1];
                local_4c8.data._M_elems[2] = local_448.data._M_elems[2];
                local_4c8.data._M_elems[3] = local_448.data._M_elems[3];
                local_4c8.exp = local_448.exp;
                local_4c8.neg = local_448.neg;
                local_4c8.fpclass = local_448.fpclass;
                local_4c8.prec_elem = local_448.prec_elem;
                pcVar15 = pcVar11;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_4c8,pcVar15);
              local_488.data._M_elems._32_5_ = local_1c0.data._M_elems._32_5_;
              local_488.data._M_elems[9]._1_3_ = local_1c0.data._M_elems[9]._1_3_;
              local_488.data._M_elems[4] = local_1c0.data._M_elems[4];
              local_488.data._M_elems[5] = local_1c0.data._M_elems[5];
              local_488.data._M_elems._24_5_ = local_1c0.data._M_elems._24_5_;
              local_488.data._M_elems[7]._1_3_ = local_1c0.data._M_elems[7]._1_3_;
              local_488.data._M_elems[0] = local_1c0.data._M_elems[0];
              local_488.data._M_elems[1] = local_1c0.data._M_elems[1];
              local_488.data._M_elems[2] = local_1c0.data._M_elems[2];
              local_488.data._M_elems[3] = local_1c0.data._M_elems[3];
              local_488.exp = local_1c0.exp;
              local_488.neg = local_1c0.neg;
              local_488.fpclass = local_1c0.fpclass;
              local_488.prec_elem = local_1c0.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_488,&local_4c8);
              local_508.data._M_elems[0] = local_488.data._M_elems[0];
              local_508.data._M_elems[1] = local_488.data._M_elems[1];
              local_508.data._M_elems[2] = local_488.data._M_elems[2];
              local_508.data._M_elems[3] = local_488.data._M_elems[3];
              local_508.data._M_elems[4] = local_488.data._M_elems[4];
              local_508.data._M_elems[5] = local_488.data._M_elems[5];
              local_508.data._M_elems._24_5_ = local_488.data._M_elems._24_5_;
              local_508.data._M_elems[7]._1_3_ = local_488.data._M_elems[7]._1_3_;
              local_508.data._M_elems._32_5_ = local_488.data._M_elems._32_5_;
              local_508.data._M_elems[9]._1_3_ = local_488.data._M_elems[9]._1_3_;
              local_508.exp = local_488.exp;
              local_508.neg = local_488.neg;
              local_508.fpclass = local_488.fpclass;
              local_508.prec_elem = local_488.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_508,&local_688);
              auVar6 = (undefined1  [16])local_4c8.data._M_elems._0_16_;
              pnVar10 = (local_610->rowWeight).data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
              *(undefined8 *)puVar2 = local_508.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_508.data._M_elems._8_8_;
              puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
              *(undefined8 *)puVar2 = local_508.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_508.data._M_elems[7]._1_3_,local_508.data._M_elems._24_5_);
              *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                   CONCAT35(local_508.data._M_elems[9]._1_3_,local_508.data._M_elems._32_5_);
              *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_508.exp;
              *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_508.neg;
              *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = local_508._48_8_;
              local_508.data._M_elems._32_5_ =
                   SUB85(CONCAT44(local_688.data._M_elems[9],local_688.data._M_elems[8]),0);
              local_508.data._M_elems[9]._1_3_ = (undefined3)(local_688.data._M_elems[9] >> 8);
              local_508.data._M_elems[4] = local_688.data._M_elems[4];
              local_508.data._M_elems[5] = local_688.data._M_elems[5];
              local_508.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
              local_508.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
              local_508.data._M_elems[0] = local_688.data._M_elems[0];
              local_508.data._M_elems[1] = local_688.data._M_elems[1];
              uVar12 = local_508.data._M_elems._0_8_;
              local_508.data._M_elems[2] = local_688.data._M_elems[2];
              local_508.data._M_elems[3] = local_688.data._M_elems[3];
              local_508.exp = local_688.exp;
              local_508.neg = local_688.neg;
              local_508.fpclass = local_688.fpclass;
              local_508.prec_elem = local_688.prec_elem;
              if ((local_688.neg == true) &&
                 (local_508.data._M_elems[0] = local_688.data._M_elems[0],
                 local_508.data._M_elems[0] != 0 || local_688.fpclass != cpp_dec_float_finite)) {
                local_508.neg = false;
              }
              local_488.data._M_elems._32_5_ = local_4c8.data._M_elems._32_5_;
              local_488.data._M_elems[9]._1_3_ = local_4c8.data._M_elems[9]._1_3_;
              local_488.data._M_elems[4] = local_4c8.data._M_elems[4];
              local_488.data._M_elems[5] = local_4c8.data._M_elems[5];
              local_488.data._M_elems._24_5_ = local_4c8.data._M_elems._24_5_;
              local_488.data._M_elems[7]._1_3_ = local_4c8.data._M_elems[7]._1_3_;
              local_488.data._M_elems[0] = local_4c8.data._M_elems[0];
              local_488.data._M_elems[1] = local_4c8.data._M_elems[1];
              uVar7 = local_488.data._M_elems._0_8_;
              local_488.data._M_elems[2] = local_4c8.data._M_elems[2];
              local_488.data._M_elems[3] = local_4c8.data._M_elems[3];
              local_488.exp = local_4c8.exp;
              local_488.neg = local_4c8.neg;
              local_488.fpclass = local_4c8.fpclass;
              local_488.prec_elem = local_4c8.prec_elem;
              if ((local_4c8.neg == true) &&
                 (local_488.data._M_elems[0] = auVar6._0_4_,
                 local_488.data._M_elems[0] != 0 || local_4c8.fpclass != cpp_dec_float_finite)) {
                local_488.neg = false;
              }
              local_508.data._M_elems._0_8_ = uVar12;
              local_4c8.data._M_elems._0_16_ = auVar6;
              local_488.data._M_elems._0_8_ = uVar7;
              if (local_4c8.fpclass == cpp_dec_float_NaN || local_688.fpclass == cpp_dec_float_NaN)
              {
                bVar8 = false;
              }
              else {
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_508,&local_488);
                bVar8 = SUB41((uint)iVar9 >> 0x1f,0);
              }
              (local_610->rowRight).data[uVar13 - 2] = bVar8;
            }
          }
          else {
            pnVar10 = (local_610->rowWeight).data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&(pnVar10->m_backend).data + lVar17 + -0x18) =
                 CONCAT35(local_f8.data._M_elems[9]._1_3_,local_f8.data._M_elems._32_5_);
            puVar2 = (uint *)((long)&(pnVar10->m_backend).data + lVar17 + -0x28);
            *(undefined8 *)puVar2 = local_f8.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_f8.data._M_elems[7]._1_3_,local_f8.data._M_elems._24_5_);
            puVar2 = (uint *)((long)&pnVar10[-1].m_backend.data + lVar17);
            *(undefined8 *)puVar2 = local_f8.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_f8.data._M_elems._8_8_;
            *(int *)((long)&(pnVar10->m_backend).data + lVar17 + -0x10) = local_f8.exp;
            *(bool *)((long)&(pnVar10->m_backend).data + lVar17 + -0xc) = local_f8.neg;
            uVar12 = local_f8._48_8_;
LAB_0033f91d:
            *(undefined8 *)((long)&(pnVar10->m_backend).data + lVar17 + -8) = uVar12;
          }
        }
        uVar13 = uVar13 - 1;
        lVar17 = lVar17 + -0x38;
      } while (1 < uVar13);
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}